

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_fp16s.h
# Opt level: O0

void ncnn::innerproduct_fp16s_pack16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_fp16,Mat *bias_data,
               int activation_type,Mat *activation_params,Option *opt)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [32];
  undefined8 uVar19;
  ulong uVar20;
  ushort uVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [40];
  undefined1 auVar98 [48];
  undefined1 auVar99 [56];
  undefined1 auVar100 [32];
  undefined1 auVar101 [40];
  undefined1 auVar102 [48];
  undefined1 auVar103 [56];
  int iVar104;
  undefined8 *puVar105;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  long *in_R9;
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  float *outptr;
  __m512 _w;
  __m512 _val;
  __m512 _w3_1;
  __m512 _val3_1;
  __m512 _w2_1;
  __m512 _val2_1;
  __m512i _w23_1;
  __m512 _w1_1;
  __m512 _val1_1;
  __m512 _w0_1;
  __m512 _val0_1;
  __m512i _w01_1;
  __m512 _w7;
  __m512 _val7;
  __m512 _w6;
  __m512 _val6;
  __m512i _w67;
  __m512 _w5;
  __m512 _val5;
  __m512 _w4;
  __m512 _val4;
  __m512i _w45;
  __m512 _w3;
  __m512 _val3;
  __m512 _w2;
  __m512 _val2;
  __m512i _w23;
  __m512 _w1;
  __m512 _val1;
  __m512 _w0;
  __m512 _val0;
  __m512i _w01;
  int i;
  float *sptr;
  unsigned_short *kptr;
  __m512 _sum7;
  __m512 _sum6;
  __m512 _sum5;
  __m512 _sum4;
  __m512 _sum3;
  __m512 _sum2;
  __m512 _sum1;
  __m512 _sum0;
  int p;
  float *bias_data_ptr;
  int num_output;
  int num_input;
  __m512 _b;
  __m512 _a;
  __m512 max;
  __m512 min;
  __mmask16 _is_negative;
  __m512 one;
  __m512 one_7;
  __m512 pow2n_1;
  __m512 y_1;
  __mmask16 mask_1;
  __m512 one_2;
  __m512i imm0_1;
  __m512 fx_1;
  __m512 tmp_1;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask;
  __m512 one_1;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m512 two;
  __m512 one_4;
  __m512 one_5;
  __m512 pow2n_2;
  __m512 y_3;
  __mmask16 mask_3;
  __m512 one_6;
  __m512i imm0_3;
  __m512 fx_2;
  __m512 tmp_3;
  __m512 y_2;
  __m512 z;
  __m512 tmp_2;
  __mmask16 mask_2;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one_3;
  __m512i imm0_2;
  int local_77d4;
  uint *local_77d0;
  undefined1 (*local_77c8) [64];
  undefined1 local_77c0 [64];
  undefined1 local_7780 [64];
  undefined1 local_7740 [64];
  undefined1 local_7700 [64];
  undefined1 local_76c0 [64];
  undefined1 local_7680 [64];
  undefined1 local_7640 [64];
  undefined1 local_7600 [64];
  int local_7584;
  undefined1 local_6380 [64];
  int local_5080;
  int iStack_507c;
  int iStack_5078;
  int iStack_5074;
  int iStack_5070;
  int iStack_506c;
  int iStack_5068;
  int iStack_5064;
  int iStack_5060;
  int iStack_505c;
  int iStack_5058;
  int iStack_5054;
  int iStack_5050;
  int iStack_504c;
  int iStack_5048;
  int iStack_5044;
  undefined1 local_4e00 [256];
  undefined1 local_4d00 [16];
  undefined8 uStack_4cf0;
  undefined8 uStack_4ce8;
  undefined8 uStack_4ce0;
  undefined8 uStack_4cd8;
  undefined8 uStack_4cd0;
  undefined8 uStack_4cc8;
  undefined1 local_4400 [256];
  undefined1 local_4300 [16];
  undefined8 uStack_42f0;
  undefined8 uStack_42e8;
  undefined8 uStack_42e0;
  undefined8 uStack_42d8;
  undefined8 uStack_42d0;
  undefined8 uStack_42c8;
  int local_3900;
  int iStack_38fc;
  int iStack_38f8;
  int iStack_38f4;
  int iStack_38f0;
  int iStack_38ec;
  int iStack_38e8;
  int iStack_38e4;
  int iStack_38e0;
  int iStack_38dc;
  int iStack_38d8;
  int iStack_38d4;
  int iStack_38d0;
  int iStack_38cc;
  int iStack_38c8;
  int iStack_38c4;
  int local_3780;
  int iStack_377c;
  int iStack_3778;
  int iStack_3774;
  int iStack_3770;
  int iStack_376c;
  int iStack_3768;
  int iStack_3764;
  int iStack_3760;
  int iStack_375c;
  int iStack_3758;
  int iStack_3754;
  int iStack_3750;
  int iStack_374c;
  int iStack_3748;
  int iStack_3744;
  undefined1 local_2b80 [256];
  undefined1 local_2a80 [16];
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 uStack_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  int local_2080;
  int iStack_207c;
  int iStack_2078;
  int iStack_2074;
  int iStack_2070;
  int iStack_206c;
  int iStack_2068;
  int iStack_2064;
  int iStack_2060;
  int iStack_205c;
  int iStack_2058;
  int iStack_2054;
  int iStack_2050;
  int iStack_204c;
  int iStack_2048;
  int iStack_2044;
  undefined1 local_1c80 [256];
  undefined1 local_1b80 [16];
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 uStack_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined1 local_1a80 [16];
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  int local_e40;
  int iStack_e3c;
  int iStack_e38;
  int iStack_e34;
  int iStack_e30;
  int iStack_e2c;
  int iStack_e28;
  int iStack_e24;
  int iStack_e20;
  int iStack_e1c;
  int iStack_e18;
  int iStack_e14;
  int iStack_e10;
  int iStack_e0c;
  int iStack_e08;
  int iStack_e04;
  int local_800;
  int iStack_7fc;
  int iStack_7f8;
  int iStack_7f4;
  int iStack_7f0;
  int iStack_7ec;
  int iStack_7e8;
  int iStack_7e4;
  int iStack_7e0;
  int iStack_7dc;
  int iStack_7d8;
  int iStack_7d4;
  int iStack_7d0;
  int iStack_7cc;
  int iStack_7c8;
  int iStack_7c4;
  
  iVar104 = *(int *)((long)in_RDI + 0x2c) * *(int *)(in_RDI + 3);
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar2 = *in_RCX;
  for (local_7584 = 0; local_7584 < iVar1; local_7584 = local_7584 + 1) {
    local_7600 = ZEXT1664(ZEXT816(0));
    local_7640 = ZEXT1664(ZEXT816(0));
    local_7680 = ZEXT1664(ZEXT816(0));
    local_76c0 = ZEXT1664(ZEXT816(0));
    local_7700 = ZEXT1664(ZEXT816(0));
    local_7740 = ZEXT1664(ZEXT816(0));
    local_7780 = ZEXT1664(ZEXT816(0));
    local_77c0 = ZEXT1664(ZEXT816(0));
    if (lVar2 != 0) {
      local_7600 = *(undefined1 (*) [64])(lVar2 + (long)(local_7584 << 4) * 4);
    }
    local_77c8 = (undefined1 (*) [64])
                 (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_7584 * in_RDX[2]);
    local_77d0 = (uint *)*in_RDI;
    for (local_77d4 = 0; local_77d4 + 7 < iVar104; local_77d4 = local_77d4 + 8) {
      auVar106 = vmovdqu64_avx512f(*local_77c8);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vbroadcastss_avx512f(ZEXT416(*local_77d0));
      auVar108 = vcvtph2ps_avx512f(auVar106._0_32_);
      local_7600 = vfmadd213ps_avx512f(auVar108,auVar107,local_7600);
      auVar107 = vbroadcastss_avx512f(ZEXT416(local_77d0[1]));
      auVar106 = vcvtph2ps_avx512f(auVar106._32_32_);
      local_7640 = vfmadd213ps_avx512f(auVar106,auVar107,local_7640);
      auVar106 = vmovdqu64_avx512f(local_77c8[1]);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vbroadcastss_avx512f(ZEXT416(local_77d0[2]));
      auVar108 = vcvtph2ps_avx512f(auVar106._0_32_);
      local_7680 = vfmadd213ps_avx512f(auVar108,auVar107,local_7680);
      auVar107 = vbroadcastss_avx512f(ZEXT416(local_77d0[3]));
      auVar106 = vcvtph2ps_avx512f(auVar106._32_32_);
      local_76c0 = vfmadd213ps_avx512f(auVar106,auVar107,local_76c0);
      auVar106 = vmovdqu64_avx512f(local_77c8[2]);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vbroadcastss_avx512f(ZEXT416(local_77d0[4]));
      auVar108 = vcvtph2ps_avx512f(auVar106._0_32_);
      local_7700 = vfmadd213ps_avx512f(auVar108,auVar107,local_7700);
      auVar107 = vbroadcastss_avx512f(ZEXT416(local_77d0[5]));
      auVar106 = vcvtph2ps_avx512f(auVar106._32_32_);
      local_7740 = vfmadd213ps_avx512f(auVar106,auVar107,local_7740);
      auVar106 = vmovdqu64_avx512f(local_77c8[3]);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vbroadcastss_avx512f(ZEXT416(local_77d0[6]));
      auVar108 = vcvtph2ps_avx512f(auVar106._0_32_);
      local_7780 = vfmadd213ps_avx512f(auVar108,auVar107,local_7780);
      auVar107 = vbroadcastss_avx512f(ZEXT416(local_77d0[7]));
      auVar106 = vcvtph2ps_avx512f(auVar106._32_32_);
      local_77c0 = vfmadd213ps_avx512f(auVar106,auVar107,local_77c0);
      local_77d0 = local_77d0 + 8;
      local_77c8 = local_77c8 + 4;
    }
    for (; local_77d4 + 3 < iVar104; local_77d4 = local_77d4 + 4) {
      auVar106 = vmovdqu64_avx512f(*local_77c8);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vbroadcastss_avx512f(ZEXT416(*local_77d0));
      auVar108 = vcvtph2ps_avx512f(auVar106._0_32_);
      local_7600 = vfmadd213ps_avx512f(auVar108,auVar107,local_7600);
      auVar107 = vbroadcastss_avx512f(ZEXT416(local_77d0[1]));
      auVar106 = vcvtph2ps_avx512f(auVar106._32_32_);
      local_7640 = vfmadd213ps_avx512f(auVar106,auVar107,local_7640);
      auVar106 = vmovdqu64_avx512f(local_77c8[1]);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vbroadcastss_avx512f(ZEXT416(local_77d0[2]));
      auVar108 = vcvtph2ps_avx512f(auVar106._0_32_);
      local_7680 = vfmadd213ps_avx512f(auVar108,auVar107,local_7680);
      auVar107 = vbroadcastss_avx512f(ZEXT416(local_77d0[3]));
      auVar106 = vcvtph2ps_avx512f(auVar106._32_32_);
      local_76c0 = vfmadd213ps_avx512f(auVar106,auVar107,local_76c0);
      local_77d0 = local_77d0 + 4;
      local_77c8 = local_77c8 + 2;
    }
    for (; local_77d4 < iVar104; local_77d4 = local_77d4 + 1) {
      auVar106 = vbroadcastss_avx512f(ZEXT416(*local_77d0));
      auVar18 = vlddqu_avx(*(undefined1 (*) [32])*local_77c8);
      auVar107 = vcvtph2ps_avx512f(auVar18);
      local_7600 = vfmadd213ps_avx512f(auVar107,auVar106,local_7600);
      local_77d0 = local_77d0 + 1;
      local_77c8 = (undefined1 (*) [64])(*local_77c8 + 0x20);
    }
    auVar106 = vaddps_avx512f(local_7600,local_7640);
    auVar107 = vaddps_avx512f(local_7680,local_76c0);
    auVar108 = vaddps_avx512f(local_7700,local_7740);
    auVar109 = vaddps_avx512f(local_7780,local_77c0);
    auVar106 = vaddps_avx512f(auVar106,auVar107);
    auVar107 = vaddps_avx512f(auVar108,auVar109);
    local_6380 = vaddps_avx512f(auVar106,auVar107);
    switch(in_R8D) {
    case 1:
      local_6380 = vmaxps_avx512f(local_6380,ZEXT1664(ZEXT816(0)));
      break;
    case 2:
      uVar19 = vcmpps_avx512f(local_6380,ZEXT1664(ZEXT816(0)),1);
      uVar21 = (ushort)uVar19;
      auVar106 = vbroadcastss_avx512f(ZEXT416(*(uint *)*in_R9));
      local_5080 = local_6380._0_4_;
      iStack_507c = local_6380._4_4_;
      iStack_5078 = local_6380._8_4_;
      iStack_5074 = local_6380._12_4_;
      iStack_5070 = local_6380._16_4_;
      iStack_506c = local_6380._20_4_;
      iStack_5068 = local_6380._24_4_;
      iStack_5064 = local_6380._28_4_;
      iStack_5060 = local_6380._32_4_;
      iStack_505c = local_6380._36_4_;
      iStack_5058 = local_6380._40_4_;
      iStack_5054 = local_6380._44_4_;
      iStack_5050 = local_6380._48_4_;
      iStack_504c = local_6380._52_4_;
      iStack_5048 = local_6380._56_4_;
      iStack_5044 = local_6380._60_4_;
      auVar106 = vmulps_avx512f(local_6380,auVar106);
      bVar3 = (bool)((byte)uVar19 & 1);
      bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar6 = (bool)((byte)(uVar21 >> 3) & 1);
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      bVar8 = (bool)((byte)(uVar21 >> 5) & 1);
      bVar9 = (bool)((byte)(uVar21 >> 6) & 1);
      bVar10 = (bool)((byte)(uVar21 >> 7) & 1);
      bVar11 = (byte)((ulong)uVar19 >> 8);
      bVar12 = (bool)(bVar11 >> 1 & 1);
      bVar13 = (bool)(bVar11 >> 2 & 1);
      bVar14 = (bool)(bVar11 >> 3 & 1);
      bVar15 = (bool)(bVar11 >> 4 & 1);
      bVar16 = (bool)(bVar11 >> 5 & 1);
      bVar17 = (bool)(bVar11 >> 6 & 1);
      local_6380._4_4_ = (uint)bVar4 * auVar106._4_4_ | (uint)!bVar4 * iStack_507c;
      local_6380._0_4_ = (uint)bVar3 * auVar106._0_4_ | (uint)!bVar3 * local_5080;
      local_6380._8_4_ = (uint)bVar5 * auVar106._8_4_ | (uint)!bVar5 * iStack_5078;
      local_6380._12_4_ = (uint)bVar6 * auVar106._12_4_ | (uint)!bVar6 * iStack_5074;
      local_6380._16_4_ = (uint)bVar7 * auVar106._16_4_ | (uint)!bVar7 * iStack_5070;
      local_6380._20_4_ = (uint)bVar8 * auVar106._20_4_ | (uint)!bVar8 * iStack_506c;
      local_6380._24_4_ = (uint)bVar9 * auVar106._24_4_ | (uint)!bVar9 * iStack_5068;
      local_6380._28_4_ = (uint)bVar10 * auVar106._28_4_ | (uint)!bVar10 * iStack_5064;
      local_6380._32_4_ =
           (uint)(bVar11 & 1) * auVar106._32_4_ | (uint)!(bool)(bVar11 & 1) * iStack_5060;
      local_6380._36_4_ = (uint)bVar12 * auVar106._36_4_ | (uint)!bVar12 * iStack_505c;
      local_6380._40_4_ = (uint)bVar13 * auVar106._40_4_ | (uint)!bVar13 * iStack_5058;
      local_6380._44_4_ = (uint)bVar14 * auVar106._44_4_ | (uint)!bVar14 * iStack_5054;
      local_6380._48_4_ = (uint)bVar15 * auVar106._48_4_ | (uint)!bVar15 * iStack_5050;
      local_6380._52_4_ = (uint)bVar16 * auVar106._52_4_ | (uint)!bVar16 * iStack_504c;
      local_6380._56_4_ = (uint)bVar17 * auVar106._56_4_ | (uint)!bVar17 * iStack_5048;
      local_6380._60_4_ =
           (uint)(bVar11 >> 7) * auVar106._60_4_ | (uint)!(bool)(bVar11 >> 7) * iStack_5044;
      break;
    case 3:
      auVar106 = vbroadcastss_avx512f(ZEXT416(*(uint *)*in_R9));
      auVar107 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*in_R9 + 4)));
      auVar106 = vmaxps_avx512f(local_6380,auVar106);
      local_6380 = vminps_avx512f(auVar106,auVar107);
      break;
    case 4:
      auVar108 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar106 = vsubps_avx512f(ZEXT1664(ZEXT816(0)),local_6380);
      auVar35._8_4_ = 88.37626;
      auVar35._12_4_ = 88.37626;
      auVar35._0_4_ = 88.37626;
      auVar35._4_4_ = 88.37626;
      auVar35._16_4_ = 88.37626;
      auVar35._20_4_ = 88.37626;
      auVar35._24_4_ = 88.37626;
      auVar35._28_4_ = 88.37626;
      auVar35._32_4_ = 88.37626;
      auVar35._36_4_ = 88.37626;
      auVar35._40_4_ = 88.37626;
      auVar35._44_4_ = 88.37626;
      auVar35._48_4_ = 88.37626;
      auVar35._52_4_ = 88.37626;
      auVar35._56_4_ = 88.37626;
      auVar35._60_4_ = 88.37626;
      auVar106 = vminps_avx512f(auVar106,auVar35);
      auVar34._8_4_ = -88.37626;
      auVar34._12_4_ = -88.37626;
      auVar34._0_4_ = -88.37626;
      auVar34._4_4_ = -88.37626;
      auVar34._16_4_ = -88.37626;
      auVar34._20_4_ = -88.37626;
      auVar34._24_4_ = -88.37626;
      auVar34._28_4_ = -88.37626;
      auVar34._32_4_ = -88.37626;
      auVar34._36_4_ = -88.37626;
      auVar34._40_4_ = -88.37626;
      auVar34._44_4_ = -88.37626;
      auVar34._48_4_ = -88.37626;
      auVar34._52_4_ = -88.37626;
      auVar34._56_4_ = -88.37626;
      auVar34._60_4_ = -88.37626;
      auVar107 = vmaxps_avx512f(auVar106,auVar34);
      auVar32._8_4_ = 1.442695;
      auVar32._12_4_ = 1.442695;
      auVar32._0_4_ = 1.442695;
      auVar32._4_4_ = 1.442695;
      auVar32._16_4_ = 1.442695;
      auVar32._20_4_ = 1.442695;
      auVar32._24_4_ = 1.442695;
      auVar32._28_4_ = 1.442695;
      auVar32._32_4_ = 1.442695;
      auVar32._36_4_ = 1.442695;
      auVar32._40_4_ = 1.442695;
      auVar32._44_4_ = 1.442695;
      auVar32._48_4_ = 1.442695;
      auVar32._52_4_ = 1.442695;
      auVar32._56_4_ = 1.442695;
      auVar32._60_4_ = 1.442695;
      auVar31._8_4_ = 0.5;
      auVar31._12_4_ = 0.5;
      auVar31._0_4_ = 0.5;
      auVar31._4_4_ = 0.5;
      auVar31._16_4_ = 0.5;
      auVar31._20_4_ = 0.5;
      auVar31._24_4_ = 0.5;
      auVar31._28_4_ = 0.5;
      auVar31._32_4_ = 0.5;
      auVar31._36_4_ = 0.5;
      auVar31._40_4_ = 0.5;
      auVar31._44_4_ = 0.5;
      auVar31._48_4_ = 0.5;
      auVar31._52_4_ = 0.5;
      auVar31._56_4_ = 0.5;
      auVar31._60_4_ = 0.5;
      auVar106 = vfmadd213ps_avx512f(auVar32,auVar107,auVar31);
      auVar109 = vrndscaleps_avx512f(auVar106,1);
      uVar19 = vcmpps_avx512f(auVar106,auVar109,1);
      uVar21 = (ushort)uVar19;
      auVar36._8_4_ = 1.0;
      auVar36._12_4_ = 1.0;
      auVar36._0_4_ = 1.0;
      auVar36._4_4_ = 1.0;
      auVar36._16_4_ = 1.0;
      auVar36._20_4_ = 1.0;
      auVar36._24_4_ = 1.0;
      auVar36._28_4_ = 1.0;
      auVar36._32_4_ = 1.0;
      auVar36._36_4_ = 1.0;
      auVar36._40_4_ = 1.0;
      auVar36._44_4_ = 1.0;
      auVar36._48_4_ = 1.0;
      auVar36._52_4_ = 1.0;
      auVar36._56_4_ = 1.0;
      auVar36._60_4_ = 1.0;
      local_3900 = auVar109._0_4_;
      iStack_38fc = auVar109._4_4_;
      iStack_38f8 = auVar109._8_4_;
      iStack_38f4 = auVar109._12_4_;
      iStack_38f0 = auVar109._16_4_;
      iStack_38ec = auVar109._20_4_;
      iStack_38e8 = auVar109._24_4_;
      iStack_38e4 = auVar109._28_4_;
      iStack_38e0 = auVar109._32_4_;
      iStack_38dc = auVar109._36_4_;
      iStack_38d8 = auVar109._40_4_;
      iStack_38d4 = auVar109._44_4_;
      iStack_38d0 = auVar109._48_4_;
      iStack_38cc = auVar109._52_4_;
      iStack_38c8 = auVar109._56_4_;
      iStack_38c4 = auVar109._60_4_;
      auVar106 = vsubps_avx512f(auVar109,auVar36);
      bVar3 = (bool)((byte)uVar19 & 1);
      bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar6 = (bool)((byte)(uVar21 >> 3) & 1);
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      bVar8 = (bool)((byte)(uVar21 >> 5) & 1);
      bVar9 = (bool)((byte)(uVar21 >> 6) & 1);
      bVar10 = (bool)((byte)(uVar21 >> 7) & 1);
      bVar11 = (byte)((ulong)uVar19 >> 8);
      bVar12 = (bool)(bVar11 >> 1 & 1);
      bVar13 = (bool)(bVar11 >> 2 & 1);
      bVar14 = (bool)(bVar11 >> 3 & 1);
      bVar15 = (bool)(bVar11 >> 4 & 1);
      bVar16 = (bool)(bVar11 >> 5 & 1);
      bVar17 = (bool)(bVar11 >> 6 & 1);
      local_4300._4_4_ = (uint)bVar4 * auVar106._4_4_ | (uint)!bVar4 * iStack_38fc;
      local_4300._0_4_ = (uint)bVar3 * auVar106._0_4_ | (uint)!bVar3 * local_3900;
      local_4300._8_4_ = (uint)bVar5 * auVar106._8_4_ | (uint)!bVar5 * iStack_38f8;
      local_4300._12_4_ = (uint)bVar6 * auVar106._12_4_ | (uint)!bVar6 * iStack_38f4;
      uStack_42f0._0_4_ = (uint)bVar7 * auVar106._16_4_ | (uint)!bVar7 * iStack_38f0;
      uStack_42f0._4_4_ = (uint)bVar8 * auVar106._20_4_ | (uint)!bVar8 * iStack_38ec;
      uStack_42e8._0_4_ = (uint)bVar9 * auVar106._24_4_ | (uint)!bVar9 * iStack_38e8;
      uStack_42e8._4_4_ = (uint)bVar10 * auVar106._28_4_ | (uint)!bVar10 * iStack_38e4;
      auVar18 = _local_4300;
      uStack_42e0._0_4_ =
           (uint)(bVar11 & 1) * auVar106._32_4_ | (uint)!(bool)(bVar11 & 1) * iStack_38e0;
      uStack_42e0._4_4_ = (uint)bVar12 * auVar106._36_4_ | (uint)!bVar12 * iStack_38dc;
      auVar97 = _local_4300;
      uStack_42d8._0_4_ = (uint)bVar13 * auVar106._40_4_ | (uint)!bVar13 * iStack_38d8;
      uStack_42d8._4_4_ = (uint)bVar14 * auVar106._44_4_ | (uint)!bVar14 * iStack_38d4;
      auVar98 = _local_4300;
      uStack_42d0._0_4_ = (uint)bVar15 * auVar106._48_4_ | (uint)!bVar15 * iStack_38d0;
      uStack_42d0._4_4_ = (uint)bVar16 * auVar106._52_4_ | (uint)!bVar16 * iStack_38cc;
      auVar99 = _local_4300;
      uStack_42c8._0_4_ = (uint)bVar17 * auVar106._56_4_ | (uint)!bVar17 * iStack_38c8;
      uStack_42c8._4_4_ =
           (uint)(bVar11 >> 7) * auVar106._60_4_ | (uint)!(bool)(bVar11 >> 7) * iStack_38c4;
      auVar106 = _local_4300;
      uStack_42e8 = auVar18._24_8_;
      uStack_42e0 = auVar97._32_8_;
      uStack_42d8 = auVar98._40_8_;
      uStack_42d0 = auVar99._48_8_;
      uStack_42c8 = auVar106._56_8_;
      auVar41._16_8_ = uStack_42f0;
      auVar41._0_16_ = local_4300;
      auVar41._24_8_ = uStack_42e8;
      auVar41._32_8_ = uStack_42e0;
      auVar41._40_8_ = uStack_42d8;
      auVar41._48_8_ = uStack_42d0;
      auVar41._56_8_ = uStack_42c8;
      auVar40._8_4_ = 0.6933594;
      auVar40._12_4_ = 0.6933594;
      auVar40._0_4_ = 0.6933594;
      auVar40._4_4_ = 0.6933594;
      auVar40._16_4_ = 0.6933594;
      auVar40._20_4_ = 0.6933594;
      auVar40._24_4_ = 0.6933594;
      auVar40._28_4_ = 0.6933594;
      auVar40._32_4_ = 0.6933594;
      auVar40._36_4_ = 0.6933594;
      auVar40._40_4_ = 0.6933594;
      auVar40._44_4_ = 0.6933594;
      auVar40._48_4_ = 0.6933594;
      auVar40._52_4_ = 0.6933594;
      auVar40._56_4_ = 0.6933594;
      auVar40._60_4_ = 0.6933594;
      auVar106 = vfnmadd213ps_avx512f(auVar40,auVar41,auVar107);
      auVar39._16_8_ = uStack_42f0;
      auVar39._0_16_ = local_4300;
      auVar39._24_8_ = uStack_42e8;
      auVar39._32_8_ = uStack_42e0;
      auVar39._40_8_ = uStack_42d8;
      auVar39._48_8_ = uStack_42d0;
      auVar39._56_8_ = uStack_42c8;
      auVar38._8_4_ = -0.00021219444;
      auVar38._12_4_ = -0.00021219444;
      auVar38._0_4_ = -0.00021219444;
      auVar38._4_4_ = -0.00021219444;
      auVar38._16_4_ = -0.00021219444;
      auVar38._20_4_ = -0.00021219444;
      auVar38._24_4_ = -0.00021219444;
      auVar38._28_4_ = -0.00021219444;
      auVar38._32_4_ = -0.00021219444;
      auVar38._36_4_ = -0.00021219444;
      auVar38._40_4_ = -0.00021219444;
      auVar38._44_4_ = -0.00021219444;
      auVar38._48_4_ = -0.00021219444;
      auVar38._52_4_ = -0.00021219444;
      auVar38._56_4_ = -0.00021219444;
      auVar38._60_4_ = -0.00021219444;
      auVar106 = vfnmadd213ps_avx512f(auVar38,auVar39,auVar106);
      auVar107 = vmulps_avx512f(auVar106,auVar106);
      local_4400._8_4_ = 0.00019875691;
      local_4400._12_4_ = 0.00019875691;
      local_4400._0_4_ = 0.00019875691;
      local_4400._4_4_ = 0.00019875691;
      auVar30._16_4_ = 0.00019875691;
      auVar30._20_4_ = 0.00019875691;
      auVar30._0_16_ = local_4400._0_16_;
      auVar30._24_4_ = 0.00019875691;
      auVar30._28_4_ = 0.00019875691;
      auVar30._32_4_ = 0.00019875691;
      auVar30._36_4_ = 0.00019875691;
      auVar30._40_4_ = 0.00019875691;
      auVar30._44_4_ = 0.00019875691;
      auVar30._48_4_ = 0.00019875691;
      auVar30._52_4_ = 0.00019875691;
      auVar30._56_4_ = 0.00019875691;
      auVar30._60_4_ = 0.00019875691;
      auVar29._8_4_ = 0.0013981999;
      auVar29._12_4_ = 0.0013981999;
      auVar29._0_4_ = 0.0013981999;
      auVar29._4_4_ = 0.0013981999;
      auVar29._16_4_ = 0.0013981999;
      auVar29._20_4_ = 0.0013981999;
      auVar29._24_4_ = 0.0013981999;
      auVar29._28_4_ = 0.0013981999;
      auVar29._32_4_ = 0.0013981999;
      auVar29._36_4_ = 0.0013981999;
      auVar29._40_4_ = 0.0013981999;
      auVar29._44_4_ = 0.0013981999;
      auVar29._48_4_ = 0.0013981999;
      auVar29._52_4_ = 0.0013981999;
      auVar29._56_4_ = 0.0013981999;
      auVar29._60_4_ = 0.0013981999;
      auVar109 = vfmadd213ps_avx512f(auVar106,auVar30,auVar29);
      auVar28._8_4_ = 0.008333452;
      auVar28._12_4_ = 0.008333452;
      auVar28._0_4_ = 0.008333452;
      auVar28._4_4_ = 0.008333452;
      auVar28._16_4_ = 0.008333452;
      auVar28._20_4_ = 0.008333452;
      auVar28._24_4_ = 0.008333452;
      auVar28._28_4_ = 0.008333452;
      auVar28._32_4_ = 0.008333452;
      auVar28._36_4_ = 0.008333452;
      auVar28._40_4_ = 0.008333452;
      auVar28._44_4_ = 0.008333452;
      auVar28._48_4_ = 0.008333452;
      auVar28._52_4_ = 0.008333452;
      auVar28._56_4_ = 0.008333452;
      auVar28._60_4_ = 0.008333452;
      auVar109 = vfmadd213ps_avx512f(auVar106,auVar109,auVar28);
      auVar27._8_4_ = 0.041665796;
      auVar27._12_4_ = 0.041665796;
      auVar27._0_4_ = 0.041665796;
      auVar27._4_4_ = 0.041665796;
      auVar27._16_4_ = 0.041665796;
      auVar27._20_4_ = 0.041665796;
      auVar27._24_4_ = 0.041665796;
      auVar27._28_4_ = 0.041665796;
      auVar27._32_4_ = 0.041665796;
      auVar27._36_4_ = 0.041665796;
      auVar27._40_4_ = 0.041665796;
      auVar27._44_4_ = 0.041665796;
      auVar27._48_4_ = 0.041665796;
      auVar27._52_4_ = 0.041665796;
      auVar27._56_4_ = 0.041665796;
      auVar27._60_4_ = 0.041665796;
      auVar109 = vfmadd213ps_avx512f(auVar106,auVar109,auVar27);
      auVar26._8_4_ = 0.16666666;
      auVar26._12_4_ = 0.16666666;
      auVar26._0_4_ = 0.16666666;
      auVar26._4_4_ = 0.16666666;
      auVar26._16_4_ = 0.16666666;
      auVar26._20_4_ = 0.16666666;
      auVar26._24_4_ = 0.16666666;
      auVar26._28_4_ = 0.16666666;
      auVar26._32_4_ = 0.16666666;
      auVar26._36_4_ = 0.16666666;
      auVar26._40_4_ = 0.16666666;
      auVar26._44_4_ = 0.16666666;
      auVar26._48_4_ = 0.16666666;
      auVar26._52_4_ = 0.16666666;
      auVar26._56_4_ = 0.16666666;
      auVar26._60_4_ = 0.16666666;
      auVar109 = vfmadd213ps_avx512f(auVar106,auVar109,auVar26);
      auVar25._8_4_ = 0.5;
      auVar25._12_4_ = 0.5;
      auVar25._0_4_ = 0.5;
      auVar25._4_4_ = 0.5;
      auVar25._16_4_ = 0.5;
      auVar25._20_4_ = 0.5;
      auVar25._24_4_ = 0.5;
      auVar25._28_4_ = 0.5;
      auVar25._32_4_ = 0.5;
      auVar25._36_4_ = 0.5;
      auVar25._40_4_ = 0.5;
      auVar25._44_4_ = 0.5;
      auVar25._48_4_ = 0.5;
      auVar25._52_4_ = 0.5;
      auVar25._56_4_ = 0.5;
      auVar25._60_4_ = 0.5;
      auVar109 = vfmadd213ps_avx512f(auVar106,auVar109,auVar25);
      auVar106 = vfmadd213ps_avx512f(auVar107,auVar109,auVar106);
      auVar33._8_4_ = 1.0;
      auVar33._12_4_ = 1.0;
      auVar33._0_4_ = 1.0;
      auVar33._4_4_ = 1.0;
      auVar33._16_4_ = 1.0;
      auVar33._20_4_ = 1.0;
      auVar33._24_4_ = 1.0;
      auVar33._28_4_ = 1.0;
      auVar33._32_4_ = 1.0;
      auVar33._36_4_ = 1.0;
      auVar33._40_4_ = 1.0;
      auVar33._44_4_ = 1.0;
      auVar33._48_4_ = 1.0;
      auVar33._52_4_ = 1.0;
      auVar33._56_4_ = 1.0;
      auVar33._60_4_ = 1.0;
      auVar109 = vaddps_avx512f(auVar106,auVar33);
      auVar46._16_8_ = uStack_42f0;
      auVar46._0_16_ = local_4300;
      auVar46._24_8_ = uStack_42e8;
      auVar46._32_8_ = uStack_42e0;
      auVar46._40_8_ = uStack_42d8;
      auVar46._48_8_ = uStack_42d0;
      auVar46._56_8_ = uStack_42c8;
      auVar106 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(auVar106);
      auVar106 = vcvttps2dq_avx512f(auVar46);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vmovdqa64_avx512f(auVar107);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vmovdqa64_avx512f(auVar107);
      auVar106 = vpaddd_avx512f(auVar106,auVar107);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vpslld_avx512f(auVar106,ZEXT416(0x17));
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmulps_avx512f(auVar109,auVar106);
      auVar106 = vaddps_avx512f(auVar108,auVar106);
      local_6380 = vdivps_avx512f(auVar108,auVar106);
      break;
    case 5:
      auVar24._8_4_ = 88.37626;
      auVar24._12_4_ = 88.37626;
      auVar24._0_4_ = 88.37626;
      auVar24._4_4_ = 88.37626;
      auVar24._16_4_ = 88.37626;
      auVar24._20_4_ = 88.37626;
      auVar24._24_4_ = 88.37626;
      auVar24._28_4_ = 88.37626;
      auVar24._32_4_ = 88.37626;
      auVar24._36_4_ = 88.37626;
      auVar24._40_4_ = 88.37626;
      auVar24._44_4_ = 88.37626;
      auVar24._48_4_ = 88.37626;
      auVar24._52_4_ = 88.37626;
      auVar24._56_4_ = 88.37626;
      auVar24._60_4_ = 88.37626;
      auVar106 = vminps_avx512f(local_6380,auVar24);
      auVar23._8_4_ = -88.37626;
      auVar23._12_4_ = -88.37626;
      auVar23._0_4_ = -88.37626;
      auVar23._4_4_ = -88.37626;
      auVar23._16_4_ = -88.37626;
      auVar23._20_4_ = -88.37626;
      auVar23._24_4_ = -88.37626;
      auVar23._28_4_ = -88.37626;
      auVar23._32_4_ = -88.37626;
      auVar23._36_4_ = -88.37626;
      auVar23._40_4_ = -88.37626;
      auVar23._44_4_ = -88.37626;
      auVar23._48_4_ = -88.37626;
      auVar23._52_4_ = -88.37626;
      auVar23._56_4_ = -88.37626;
      auVar23._60_4_ = -88.37626;
      auVar107 = vmaxps_avx512f(auVar106,auVar23);
      auVar111._8_4_ = 1.442695;
      auVar111._12_4_ = 1.442695;
      auVar111._0_4_ = 1.442695;
      auVar111._4_4_ = 1.442695;
      auVar111._16_4_ = 1.442695;
      auVar111._20_4_ = 1.442695;
      auVar111._24_4_ = 1.442695;
      auVar111._28_4_ = 1.442695;
      auVar111._32_4_ = 1.442695;
      auVar111._36_4_ = 1.442695;
      auVar111._40_4_ = 1.442695;
      auVar111._44_4_ = 1.442695;
      auVar111._48_4_ = 1.442695;
      auVar111._52_4_ = 1.442695;
      auVar111._56_4_ = 1.442695;
      auVar111._60_4_ = 1.442695;
      auVar110._8_4_ = 0.5;
      auVar110._12_4_ = 0.5;
      auVar110._0_4_ = 0.5;
      auVar110._4_4_ = 0.5;
      auVar110._16_4_ = 0.5;
      auVar110._20_4_ = 0.5;
      auVar110._24_4_ = 0.5;
      auVar110._28_4_ = 0.5;
      auVar110._32_4_ = 0.5;
      auVar110._36_4_ = 0.5;
      auVar110._40_4_ = 0.5;
      auVar110._44_4_ = 0.5;
      auVar110._48_4_ = 0.5;
      auVar110._52_4_ = 0.5;
      auVar110._56_4_ = 0.5;
      auVar110._60_4_ = 0.5;
      auVar106 = vfmadd213ps_avx512f(auVar111,auVar107,auVar110);
      auVar108 = vrndscaleps_avx512f(auVar106,1);
      uVar19 = vcmpps_avx512f(auVar106,auVar108,1);
      uVar21 = (ushort)uVar19;
      auVar37._8_4_ = 1.0;
      auVar37._12_4_ = 1.0;
      auVar37._0_4_ = 1.0;
      auVar37._4_4_ = 1.0;
      auVar37._16_4_ = 1.0;
      auVar37._20_4_ = 1.0;
      auVar37._24_4_ = 1.0;
      auVar37._28_4_ = 1.0;
      auVar37._32_4_ = 1.0;
      auVar37._36_4_ = 1.0;
      auVar37._40_4_ = 1.0;
      auVar37._44_4_ = 1.0;
      auVar37._48_4_ = 1.0;
      auVar37._52_4_ = 1.0;
      auVar37._56_4_ = 1.0;
      auVar37._60_4_ = 1.0;
      local_3780 = auVar108._0_4_;
      iStack_377c = auVar108._4_4_;
      iStack_3778 = auVar108._8_4_;
      iStack_3774 = auVar108._12_4_;
      iStack_3770 = auVar108._16_4_;
      iStack_376c = auVar108._20_4_;
      iStack_3768 = auVar108._24_4_;
      iStack_3764 = auVar108._28_4_;
      iStack_3760 = auVar108._32_4_;
      iStack_375c = auVar108._36_4_;
      iStack_3758 = auVar108._40_4_;
      iStack_3754 = auVar108._44_4_;
      iStack_3750 = auVar108._48_4_;
      iStack_374c = auVar108._52_4_;
      iStack_3748 = auVar108._56_4_;
      iStack_3744 = auVar108._60_4_;
      auVar106 = vsubps_avx512f(auVar108,auVar37);
      bVar3 = (bool)((byte)uVar19 & 1);
      bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar6 = (bool)((byte)(uVar21 >> 3) & 1);
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      bVar8 = (bool)((byte)(uVar21 >> 5) & 1);
      bVar9 = (bool)((byte)(uVar21 >> 6) & 1);
      bVar10 = (bool)((byte)(uVar21 >> 7) & 1);
      bVar11 = (byte)((ulong)uVar19 >> 8);
      bVar12 = (bool)(bVar11 >> 1 & 1);
      bVar13 = (bool)(bVar11 >> 2 & 1);
      bVar14 = (bool)(bVar11 >> 3 & 1);
      bVar15 = (bool)(bVar11 >> 4 & 1);
      bVar16 = (bool)(bVar11 >> 5 & 1);
      bVar17 = (bool)(bVar11 >> 6 & 1);
      local_4d00._4_4_ = (uint)bVar4 * auVar106._4_4_ | (uint)!bVar4 * iStack_377c;
      local_4d00._0_4_ = (uint)bVar3 * auVar106._0_4_ | (uint)!bVar3 * local_3780;
      local_4d00._8_4_ = (uint)bVar5 * auVar106._8_4_ | (uint)!bVar5 * iStack_3778;
      local_4d00._12_4_ = (uint)bVar6 * auVar106._12_4_ | (uint)!bVar6 * iStack_3774;
      uStack_4cf0._0_4_ = (uint)bVar7 * auVar106._16_4_ | (uint)!bVar7 * iStack_3770;
      uStack_4cf0._4_4_ = (uint)bVar8 * auVar106._20_4_ | (uint)!bVar8 * iStack_376c;
      uStack_4ce8._0_4_ = (uint)bVar9 * auVar106._24_4_ | (uint)!bVar9 * iStack_3768;
      uStack_4ce8._4_4_ = (uint)bVar10 * auVar106._28_4_ | (uint)!bVar10 * iStack_3764;
      auVar18 = _local_4d00;
      uStack_4ce0._0_4_ =
           (uint)(bVar11 & 1) * auVar106._32_4_ | (uint)!(bool)(bVar11 & 1) * iStack_3760;
      uStack_4ce0._4_4_ = (uint)bVar12 * auVar106._36_4_ | (uint)!bVar12 * iStack_375c;
      auVar97 = _local_4d00;
      uStack_4cd8._0_4_ = (uint)bVar13 * auVar106._40_4_ | (uint)!bVar13 * iStack_3758;
      uStack_4cd8._4_4_ = (uint)bVar14 * auVar106._44_4_ | (uint)!bVar14 * iStack_3754;
      auVar98 = _local_4d00;
      uStack_4cd0._0_4_ = (uint)bVar15 * auVar106._48_4_ | (uint)!bVar15 * iStack_3750;
      uStack_4cd0._4_4_ = (uint)bVar16 * auVar106._52_4_ | (uint)!bVar16 * iStack_374c;
      auVar99 = _local_4d00;
      uStack_4cc8._0_4_ = (uint)bVar17 * auVar106._56_4_ | (uint)!bVar17 * iStack_3748;
      uStack_4cc8._4_4_ =
           (uint)(bVar11 >> 7) * auVar106._60_4_ | (uint)!(bool)(bVar11 >> 7) * iStack_3744;
      auVar106 = _local_4d00;
      uStack_4ce8 = auVar18._24_8_;
      uStack_4ce0 = auVar97._32_8_;
      uStack_4cd8 = auVar98._40_8_;
      uStack_4cd0 = auVar99._48_8_;
      uStack_4cc8 = auVar106._56_8_;
      auVar45._16_8_ = uStack_4cf0;
      auVar45._0_16_ = local_4d00;
      auVar45._24_8_ = uStack_4ce8;
      auVar45._32_8_ = uStack_4ce0;
      auVar45._40_8_ = uStack_4cd8;
      auVar45._48_8_ = uStack_4cd0;
      auVar45._56_8_ = uStack_4cc8;
      auVar44._8_4_ = 0.6933594;
      auVar44._12_4_ = 0.6933594;
      auVar44._0_4_ = 0.6933594;
      auVar44._4_4_ = 0.6933594;
      auVar44._16_4_ = 0.6933594;
      auVar44._20_4_ = 0.6933594;
      auVar44._24_4_ = 0.6933594;
      auVar44._28_4_ = 0.6933594;
      auVar44._32_4_ = 0.6933594;
      auVar44._36_4_ = 0.6933594;
      auVar44._40_4_ = 0.6933594;
      auVar44._44_4_ = 0.6933594;
      auVar44._48_4_ = 0.6933594;
      auVar44._52_4_ = 0.6933594;
      auVar44._56_4_ = 0.6933594;
      auVar44._60_4_ = 0.6933594;
      auVar106 = vfnmadd213ps_avx512f(auVar44,auVar45,auVar107);
      auVar43._16_8_ = uStack_4cf0;
      auVar43._0_16_ = local_4d00;
      auVar43._24_8_ = uStack_4ce8;
      auVar43._32_8_ = uStack_4ce0;
      auVar43._40_8_ = uStack_4cd8;
      auVar43._48_8_ = uStack_4cd0;
      auVar43._56_8_ = uStack_4cc8;
      auVar42._8_4_ = -0.00021219444;
      auVar42._12_4_ = -0.00021219444;
      auVar42._0_4_ = -0.00021219444;
      auVar42._4_4_ = -0.00021219444;
      auVar42._16_4_ = -0.00021219444;
      auVar42._20_4_ = -0.00021219444;
      auVar42._24_4_ = -0.00021219444;
      auVar42._28_4_ = -0.00021219444;
      auVar42._32_4_ = -0.00021219444;
      auVar42._36_4_ = -0.00021219444;
      auVar42._40_4_ = -0.00021219444;
      auVar42._44_4_ = -0.00021219444;
      auVar42._48_4_ = -0.00021219444;
      auVar42._52_4_ = -0.00021219444;
      auVar42._56_4_ = -0.00021219444;
      auVar42._60_4_ = -0.00021219444;
      auVar110 = vfnmadd213ps_avx512f(auVar42,auVar43,auVar106);
      auVar111 = vmulps_avx512f(auVar110,auVar110);
      local_4e00._8_4_ = 0.00019875691;
      local_4e00._12_4_ = 0.00019875691;
      local_4e00._0_4_ = 0.00019875691;
      local_4e00._4_4_ = 0.00019875691;
      auVar113._16_4_ = 0.00019875691;
      auVar113._20_4_ = 0.00019875691;
      auVar113._0_16_ = local_4e00._0_16_;
      auVar113._24_4_ = 0.00019875691;
      auVar113._28_4_ = 0.00019875691;
      auVar113._32_4_ = 0.00019875691;
      auVar113._36_4_ = 0.00019875691;
      auVar113._40_4_ = 0.00019875691;
      auVar113._44_4_ = 0.00019875691;
      auVar113._48_4_ = 0.00019875691;
      auVar113._52_4_ = 0.00019875691;
      auVar113._56_4_ = 0.00019875691;
      auVar113._60_4_ = 0.00019875691;
      auVar112._8_4_ = 0.0013981999;
      auVar112._12_4_ = 0.0013981999;
      auVar112._0_4_ = 0.0013981999;
      auVar112._4_4_ = 0.0013981999;
      auVar112._16_4_ = 0.0013981999;
      auVar112._20_4_ = 0.0013981999;
      auVar112._24_4_ = 0.0013981999;
      auVar112._28_4_ = 0.0013981999;
      auVar112._32_4_ = 0.0013981999;
      auVar112._36_4_ = 0.0013981999;
      auVar112._40_4_ = 0.0013981999;
      auVar112._44_4_ = 0.0013981999;
      auVar112._48_4_ = 0.0013981999;
      auVar112._52_4_ = 0.0013981999;
      auVar112._56_4_ = 0.0013981999;
      auVar112._60_4_ = 0.0013981999;
      auVar106 = vfmadd213ps_avx512f(auVar110,auVar113,auVar112);
      auVar109._8_4_ = 0.008333452;
      auVar109._12_4_ = 0.008333452;
      auVar109._0_4_ = 0.008333452;
      auVar109._4_4_ = 0.008333452;
      auVar109._16_4_ = 0.008333452;
      auVar109._20_4_ = 0.008333452;
      auVar109._24_4_ = 0.008333452;
      auVar109._28_4_ = 0.008333452;
      auVar109._32_4_ = 0.008333452;
      auVar109._36_4_ = 0.008333452;
      auVar109._40_4_ = 0.008333452;
      auVar109._44_4_ = 0.008333452;
      auVar109._48_4_ = 0.008333452;
      auVar109._52_4_ = 0.008333452;
      auVar109._56_4_ = 0.008333452;
      auVar109._60_4_ = 0.008333452;
      auVar106 = vfmadd213ps_avx512f(auVar110,auVar106,auVar109);
      auVar108._8_4_ = 0.041665796;
      auVar108._12_4_ = 0.041665796;
      auVar108._0_4_ = 0.041665796;
      auVar108._4_4_ = 0.041665796;
      auVar108._16_4_ = 0.041665796;
      auVar108._20_4_ = 0.041665796;
      auVar108._24_4_ = 0.041665796;
      auVar108._28_4_ = 0.041665796;
      auVar108._32_4_ = 0.041665796;
      auVar108._36_4_ = 0.041665796;
      auVar108._40_4_ = 0.041665796;
      auVar108._44_4_ = 0.041665796;
      auVar108._48_4_ = 0.041665796;
      auVar108._52_4_ = 0.041665796;
      auVar108._56_4_ = 0.041665796;
      auVar108._60_4_ = 0.041665796;
      auVar106 = vfmadd213ps_avx512f(auVar110,auVar106,auVar108);
      auVar107._8_4_ = 0.16666666;
      auVar107._12_4_ = 0.16666666;
      auVar107._0_4_ = 0.16666666;
      auVar107._4_4_ = 0.16666666;
      auVar107._16_4_ = 0.16666666;
      auVar107._20_4_ = 0.16666666;
      auVar107._24_4_ = 0.16666666;
      auVar107._28_4_ = 0.16666666;
      auVar107._32_4_ = 0.16666666;
      auVar107._36_4_ = 0.16666666;
      auVar107._40_4_ = 0.16666666;
      auVar107._44_4_ = 0.16666666;
      auVar107._48_4_ = 0.16666666;
      auVar107._52_4_ = 0.16666666;
      auVar107._56_4_ = 0.16666666;
      auVar107._60_4_ = 0.16666666;
      auVar107 = vfmadd213ps_avx512f(auVar110,auVar106,auVar107);
      auVar106._8_4_ = 0.5;
      auVar106._12_4_ = 0.5;
      auVar106._0_4_ = 0.5;
      auVar106._4_4_ = 0.5;
      auVar106._16_4_ = 0.5;
      auVar106._20_4_ = 0.5;
      auVar106._24_4_ = 0.5;
      auVar106._28_4_ = 0.5;
      auVar106._32_4_ = 0.5;
      auVar106._36_4_ = 0.5;
      auVar106._40_4_ = 0.5;
      auVar106._44_4_ = 0.5;
      auVar106._48_4_ = 0.5;
      auVar106._52_4_ = 0.5;
      auVar106._56_4_ = 0.5;
      auVar106._60_4_ = 0.5;
      auVar106 = vfmadd213ps_avx512f(auVar110,auVar107,auVar106);
      auVar106 = vfmadd213ps_avx512f(auVar111,auVar106,auVar110);
      auVar22._8_4_ = 1.0;
      auVar22._12_4_ = 1.0;
      auVar22._0_4_ = 1.0;
      auVar22._4_4_ = 1.0;
      auVar22._16_4_ = 1.0;
      auVar22._20_4_ = 1.0;
      auVar22._24_4_ = 1.0;
      auVar22._28_4_ = 1.0;
      auVar22._32_4_ = 1.0;
      auVar22._36_4_ = 1.0;
      auVar22._40_4_ = 1.0;
      auVar22._44_4_ = 1.0;
      auVar22._48_4_ = 1.0;
      auVar22._52_4_ = 1.0;
      auVar22._56_4_ = 1.0;
      auVar22._60_4_ = 1.0;
      auVar108 = vaddps_avx512f(auVar106,auVar22);
      auVar47._16_8_ = uStack_4cf0;
      auVar47._0_16_ = local_4d00;
      auVar47._24_8_ = uStack_4ce8;
      auVar47._32_8_ = uStack_4ce0;
      auVar47._40_8_ = uStack_4cd8;
      auVar47._48_8_ = uStack_4cd0;
      auVar47._56_8_ = uStack_4cc8;
      auVar106 = vcvttps2dq_avx512f(auVar47);
      vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vmovdqa64_avx512f(auVar107);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vmovdqa64_avx512f(auVar107);
      auVar106 = vpaddd_avx512f(auVar106,auVar107);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vpslld_avx512f(auVar106,ZEXT416(0x17));
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmulps_avx512f(auVar108,auVar106);
      auVar107 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar106 = vaddps_avx512f(auVar106,auVar107);
      uVar20 = vcmpps_avx512f(auVar106,ZEXT1664(ZEXT816(0)),2);
      auVar88._8_4_ = 0x800000;
      auVar88._12_4_ = 0x800000;
      auVar88._0_4_ = 0x800000;
      auVar88._4_4_ = 0x800000;
      auVar88._16_4_ = 0x800000;
      auVar88._20_4_ = 0x800000;
      auVar88._24_4_ = 0x800000;
      auVar88._28_4_ = 0x800000;
      auVar88._32_4_ = 0x800000;
      auVar88._36_4_ = 0x800000;
      auVar88._40_4_ = 0x800000;
      auVar88._44_4_ = 0x800000;
      auVar88._48_4_ = 0x800000;
      auVar88._52_4_ = 0x800000;
      auVar88._56_4_ = 0x800000;
      auVar88._60_4_ = 0x800000;
      auVar107 = vmaxps_avx512f(auVar106,auVar88);
      auVar106 = vmovdqa64_avx512f(auVar107);
      auVar106 = vpsrld_avx512f(auVar106,ZEXT416(0x17));
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vmovdqa64_avx512f(auVar107);
      auVar95._8_4_ = -0x7f800001;
      auVar95._12_4_ = -0x7f800001;
      auVar95._0_4_ = -0x7f800001;
      auVar95._4_4_ = -0x7f800001;
      auVar95._16_4_ = -0x7f800001;
      auVar95._20_4_ = -0x7f800001;
      auVar95._24_4_ = -0x7f800001;
      auVar95._28_4_ = -0x7f800001;
      auVar95._32_4_ = -0x7f800001;
      auVar95._36_4_ = -0x7f800001;
      auVar95._40_4_ = -0x7f800001;
      auVar95._44_4_ = -0x7f800001;
      auVar95._48_4_ = -0x7f800001;
      auVar95._52_4_ = -0x7f800001;
      auVar95._56_4_ = -0x7f800001;
      auVar95._60_4_ = -0x7f800001;
      auVar108 = vmovdqa64_avx512f(auVar95);
      auVar107 = vpandd_avx512f(auVar107,auVar108);
      auVar107 = vmovdqa64_avx512f(auVar107);
      auVar107 = vmovdqa64_avx512f(auVar107);
      auVar96._8_4_ = 0.5;
      auVar96._12_4_ = 0.5;
      auVar96._0_4_ = 0.5;
      auVar96._4_4_ = 0.5;
      auVar96._16_4_ = 0.5;
      auVar96._20_4_ = 0.5;
      auVar96._24_4_ = 0.5;
      auVar96._28_4_ = 0.5;
      auVar96._32_4_ = 0.5;
      auVar96._36_4_ = 0.5;
      auVar96._40_4_ = 0.5;
      auVar96._44_4_ = 0.5;
      auVar96._48_4_ = 0.5;
      auVar96._52_4_ = 0.5;
      auVar96._56_4_ = 0.5;
      auVar96._60_4_ = 0.5;
      auVar108 = vmovdqa64_avx512f(auVar96);
      auVar107 = vpord_avx512f(auVar107,auVar108);
      auVar107 = vmovdqa64_avx512f(auVar107);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar108 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar108 = vmovdqa64_avx512f(auVar108);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar108 = vmovdqa64_avx512f(auVar108);
      auVar106 = vpsubd_avx512f(auVar106,auVar108);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vcvtdq2ps_avx512f(auVar106);
      auVar87._8_4_ = 1.0;
      auVar87._12_4_ = 1.0;
      auVar87._0_4_ = 1.0;
      auVar87._4_4_ = 1.0;
      auVar87._16_4_ = 1.0;
      auVar87._20_4_ = 1.0;
      auVar87._24_4_ = 1.0;
      auVar87._28_4_ = 1.0;
      auVar87._32_4_ = 1.0;
      auVar87._36_4_ = 1.0;
      auVar87._40_4_ = 1.0;
      auVar87._44_4_ = 1.0;
      auVar87._48_4_ = 1.0;
      auVar87._52_4_ = 1.0;
      auVar87._56_4_ = 1.0;
      auVar87._60_4_ = 1.0;
      auVar106 = vaddps_avx512f(auVar106,auVar87);
      uVar19 = vcmpps_avx512f(auVar107,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      uVar21 = (ushort)uVar19;
      auVar92._8_4_ = 1.0;
      auVar92._12_4_ = 1.0;
      auVar92._0_4_ = 1.0;
      auVar92._4_4_ = 1.0;
      auVar92._16_4_ = 1.0;
      auVar92._20_4_ = 1.0;
      auVar92._24_4_ = 1.0;
      auVar92._28_4_ = 1.0;
      auVar92._32_4_ = 1.0;
      auVar92._36_4_ = 1.0;
      auVar92._40_4_ = 1.0;
      auVar92._44_4_ = 1.0;
      auVar92._48_4_ = 1.0;
      auVar92._52_4_ = 1.0;
      auVar92._56_4_ = 1.0;
      auVar92._60_4_ = 1.0;
      auVar108 = vsubps_avx512f(auVar107,auVar92);
      auVar93._8_4_ = 1.0;
      auVar93._12_4_ = 1.0;
      auVar93._0_4_ = 1.0;
      auVar93._4_4_ = 1.0;
      auVar93._16_4_ = 1.0;
      auVar93._20_4_ = 1.0;
      auVar93._24_4_ = 1.0;
      auVar93._28_4_ = 1.0;
      auVar93._32_4_ = 1.0;
      auVar93._36_4_ = 1.0;
      auVar93._40_4_ = 1.0;
      auVar93._44_4_ = 1.0;
      auVar93._48_4_ = 1.0;
      auVar93._52_4_ = 1.0;
      auVar93._56_4_ = 1.0;
      auVar93._60_4_ = 1.0;
      local_e40 = auVar106._0_4_;
      iStack_e3c = auVar106._4_4_;
      iStack_e38 = auVar106._8_4_;
      iStack_e34 = auVar106._12_4_;
      iStack_e30 = auVar106._16_4_;
      iStack_e2c = auVar106._20_4_;
      iStack_e28 = auVar106._24_4_;
      iStack_e24 = auVar106._28_4_;
      iStack_e20 = auVar106._32_4_;
      iStack_e1c = auVar106._36_4_;
      iStack_e18 = auVar106._40_4_;
      iStack_e14 = auVar106._44_4_;
      iStack_e10 = auVar106._48_4_;
      iStack_e0c = auVar106._52_4_;
      iStack_e08 = auVar106._56_4_;
      iStack_e04 = auVar106._60_4_;
      auVar106 = vsubps_avx512f(auVar106,auVar93);
      bVar3 = (bool)((byte)uVar19 & 1);
      bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar6 = (bool)((byte)(uVar21 >> 3) & 1);
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      bVar8 = (bool)((byte)(uVar21 >> 5) & 1);
      bVar9 = (bool)((byte)(uVar21 >> 6) & 1);
      bVar10 = (bool)((byte)(uVar21 >> 7) & 1);
      bVar11 = (byte)((ulong)uVar19 >> 8);
      bVar12 = (bool)(bVar11 >> 1 & 1);
      bVar13 = (bool)(bVar11 >> 2 & 1);
      bVar14 = (bool)(bVar11 >> 3 & 1);
      bVar15 = (bool)(bVar11 >> 4 & 1);
      bVar16 = (bool)(bVar11 >> 5 & 1);
      bVar17 = (bool)(bVar11 >> 6 & 1);
      local_1b80._4_4_ = (uint)bVar4 * auVar106._4_4_ | (uint)!bVar4 * iStack_e3c;
      local_1b80._0_4_ = (uint)bVar3 * auVar106._0_4_ | (uint)!bVar3 * local_e40;
      local_1b80._8_4_ = (uint)bVar5 * auVar106._8_4_ | (uint)!bVar5 * iStack_e38;
      local_1b80._12_4_ = (uint)bVar6 * auVar106._12_4_ | (uint)!bVar6 * iStack_e34;
      uStack_1b70._0_4_ = (uint)bVar7 * auVar106._16_4_ | (uint)!bVar7 * iStack_e30;
      uStack_1b70._4_4_ = (uint)bVar8 * auVar106._20_4_ | (uint)!bVar8 * iStack_e2c;
      uStack_1b68._0_4_ = (uint)bVar9 * auVar106._24_4_ | (uint)!bVar9 * iStack_e28;
      uStack_1b68._4_4_ = (uint)bVar10 * auVar106._28_4_ | (uint)!bVar10 * iStack_e24;
      auVar18 = _local_1b80;
      uStack_1b60._0_4_ =
           (uint)(bVar11 & 1) * auVar106._32_4_ | (uint)!(bool)(bVar11 & 1) * iStack_e20;
      uStack_1b60._4_4_ = (uint)bVar12 * auVar106._36_4_ | (uint)!bVar12 * iStack_e1c;
      auVar97 = _local_1b80;
      uStack_1b58._0_4_ = (uint)bVar13 * auVar106._40_4_ | (uint)!bVar13 * iStack_e18;
      uStack_1b58._4_4_ = (uint)bVar14 * auVar106._44_4_ | (uint)!bVar14 * iStack_e14;
      auVar98 = _local_1b80;
      uStack_1b50._0_4_ = (uint)bVar15 * auVar106._48_4_ | (uint)!bVar15 * iStack_e10;
      uStack_1b50._4_4_ = (uint)bVar16 * auVar106._52_4_ | (uint)!bVar16 * iStack_e0c;
      auVar99 = _local_1b80;
      uStack_1b48._0_4_ = (uint)bVar17 * auVar106._56_4_ | (uint)!bVar17 * iStack_e08;
      uStack_1b48._4_4_ =
           (uint)(bVar11 >> 7) * auVar106._60_4_ | (uint)!(bool)(bVar11 >> 7) * iStack_e04;
      auVar106 = _local_1b80;
      local_800 = auVar108._0_4_;
      iStack_7fc = auVar108._4_4_;
      iStack_7f8 = auVar108._8_4_;
      iStack_7f4 = auVar108._12_4_;
      iStack_7f0 = auVar108._16_4_;
      iStack_7ec = auVar108._20_4_;
      iStack_7e8 = auVar108._24_4_;
      iStack_7e4 = auVar108._28_4_;
      iStack_7e0 = auVar108._32_4_;
      iStack_7dc = auVar108._36_4_;
      iStack_7d8 = auVar108._40_4_;
      iStack_7d4 = auVar108._44_4_;
      iStack_7d0 = auVar108._48_4_;
      iStack_7cc = auVar108._52_4_;
      iStack_7c8 = auVar108._56_4_;
      iStack_7c4 = auVar108._60_4_;
      auVar107 = vaddps_avx512f(auVar108,auVar107);
      bVar3 = (bool)((byte)uVar19 & 1);
      bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar6 = (bool)((byte)(uVar21 >> 3) & 1);
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      bVar8 = (bool)((byte)(uVar21 >> 5) & 1);
      bVar9 = (bool)((byte)(uVar21 >> 6) & 1);
      bVar10 = (bool)((byte)(uVar21 >> 7) & 1);
      bVar12 = (bool)(bVar11 >> 1 & 1);
      bVar13 = (bool)(bVar11 >> 2 & 1);
      bVar14 = (bool)(bVar11 >> 3 & 1);
      bVar15 = (bool)(bVar11 >> 4 & 1);
      bVar16 = (bool)(bVar11 >> 5 & 1);
      bVar17 = (bool)(bVar11 >> 6 & 1);
      local_1a80._4_4_ = (uint)bVar4 * auVar107._4_4_ | (uint)!bVar4 * iStack_7fc;
      local_1a80._0_4_ = (uint)bVar3 * auVar107._0_4_ | (uint)!bVar3 * local_800;
      local_1a80._8_4_ = (uint)bVar5 * auVar107._8_4_ | (uint)!bVar5 * iStack_7f8;
      local_1a80._12_4_ = (uint)bVar6 * auVar107._12_4_ | (uint)!bVar6 * iStack_7f4;
      uStack_1a70._0_4_ = (uint)bVar7 * auVar107._16_4_ | (uint)!bVar7 * iStack_7f0;
      uStack_1a70._4_4_ = (uint)bVar8 * auVar107._20_4_ | (uint)!bVar8 * iStack_7ec;
      uStack_1a68._0_4_ = (uint)bVar9 * auVar107._24_4_ | (uint)!bVar9 * iStack_7e8;
      uStack_1a68._4_4_ = (uint)bVar10 * auVar107._28_4_ | (uint)!bVar10 * iStack_7e4;
      auVar100 = _local_1a80;
      uStack_1a60._0_4_ =
           (uint)(bVar11 & 1) * auVar107._32_4_ | (uint)!(bool)(bVar11 & 1) * iStack_7e0;
      uStack_1a60._4_4_ = (uint)bVar12 * auVar107._36_4_ | (uint)!bVar12 * iStack_7dc;
      auVar101 = _local_1a80;
      uStack_1a58._0_4_ = (uint)bVar13 * auVar107._40_4_ | (uint)!bVar13 * iStack_7d8;
      uStack_1a58._4_4_ = (uint)bVar14 * auVar107._44_4_ | (uint)!bVar14 * iStack_7d4;
      auVar102 = _local_1a80;
      uStack_1a50._0_4_ = (uint)bVar15 * auVar107._48_4_ | (uint)!bVar15 * iStack_7d0;
      uStack_1a50._4_4_ = (uint)bVar16 * auVar107._52_4_ | (uint)!bVar16 * iStack_7cc;
      auVar103 = _local_1a80;
      uStack_1a48._0_4_ = (uint)bVar17 * auVar107._56_4_ | (uint)!bVar17 * iStack_7c8;
      uStack_1a48._4_4_ =
           (uint)(bVar11 >> 7) * auVar107._60_4_ | (uint)!(bool)(bVar11 >> 7) * iStack_7c4;
      auVar107 = _local_1a80;
      uStack_1a68 = auVar100._24_8_;
      uStack_1a60 = auVar101._32_8_;
      uStack_1a58 = auVar102._40_8_;
      uStack_1a50 = auVar103._48_8_;
      uStack_1a48 = auVar107._56_8_;
      auVar91._16_8_ = uStack_1a70;
      auVar91._0_16_ = local_1a80;
      auVar91._24_8_ = uStack_1a68;
      auVar91._32_8_ = uStack_1a60;
      auVar91._40_8_ = uStack_1a58;
      auVar91._48_8_ = uStack_1a50;
      auVar91._56_8_ = uStack_1a48;
      auVar90._16_8_ = uStack_1a70;
      auVar90._0_16_ = local_1a80;
      auVar90._24_8_ = uStack_1a68;
      auVar90._32_8_ = uStack_1a60;
      auVar90._40_8_ = uStack_1a58;
      auVar90._48_8_ = uStack_1a50;
      auVar90._56_8_ = uStack_1a48;
      auVar107 = vmulps_avx512f(auVar91,auVar90);
      local_1c80._8_4_ = 0.070376836;
      local_1c80._12_4_ = 0.070376836;
      local_1c80._0_4_ = 0.070376836;
      local_1c80._4_4_ = 0.070376836;
      auVar85._16_4_ = 0.070376836;
      auVar85._20_4_ = 0.070376836;
      auVar85._0_16_ = local_1c80._0_16_;
      auVar85._24_4_ = 0.070376836;
      auVar85._28_4_ = 0.070376836;
      auVar85._32_4_ = 0.070376836;
      auVar85._36_4_ = 0.070376836;
      auVar85._40_4_ = 0.070376836;
      auVar85._44_4_ = 0.070376836;
      auVar85._48_4_ = 0.070376836;
      auVar85._52_4_ = 0.070376836;
      auVar85._56_4_ = 0.070376836;
      auVar85._60_4_ = 0.070376836;
      auVar84._16_8_ = uStack_1a70;
      auVar84._0_16_ = local_1a80;
      auVar84._24_8_ = uStack_1a68;
      auVar84._32_8_ = uStack_1a60;
      auVar84._40_8_ = uStack_1a58;
      auVar84._48_8_ = uStack_1a50;
      auVar84._56_8_ = uStack_1a48;
      auVar83._8_4_ = -0.1151461;
      auVar83._12_4_ = -0.1151461;
      auVar83._0_4_ = -0.1151461;
      auVar83._4_4_ = -0.1151461;
      auVar83._16_4_ = -0.1151461;
      auVar83._20_4_ = -0.1151461;
      auVar83._24_4_ = -0.1151461;
      auVar83._28_4_ = -0.1151461;
      auVar83._32_4_ = -0.1151461;
      auVar83._36_4_ = -0.1151461;
      auVar83._40_4_ = -0.1151461;
      auVar83._44_4_ = -0.1151461;
      auVar83._48_4_ = -0.1151461;
      auVar83._52_4_ = -0.1151461;
      auVar83._56_4_ = -0.1151461;
      auVar83._60_4_ = -0.1151461;
      auVar108 = vfmadd213ps_avx512f(auVar84,auVar85,auVar83);
      auVar82._16_8_ = uStack_1a70;
      auVar82._0_16_ = local_1a80;
      auVar82._24_8_ = uStack_1a68;
      auVar82._32_8_ = uStack_1a60;
      auVar82._40_8_ = uStack_1a58;
      auVar82._48_8_ = uStack_1a50;
      auVar82._56_8_ = uStack_1a48;
      auVar81._8_4_ = 0.116769984;
      auVar81._12_4_ = 0.116769984;
      auVar81._0_4_ = 0.116769984;
      auVar81._4_4_ = 0.116769984;
      auVar81._16_4_ = 0.116769984;
      auVar81._20_4_ = 0.116769984;
      auVar81._24_4_ = 0.116769984;
      auVar81._28_4_ = 0.116769984;
      auVar81._32_4_ = 0.116769984;
      auVar81._36_4_ = 0.116769984;
      auVar81._40_4_ = 0.116769984;
      auVar81._44_4_ = 0.116769984;
      auVar81._48_4_ = 0.116769984;
      auVar81._52_4_ = 0.116769984;
      auVar81._56_4_ = 0.116769984;
      auVar81._60_4_ = 0.116769984;
      auVar108 = vfmadd213ps_avx512f(auVar82,auVar108,auVar81);
      auVar80._16_8_ = uStack_1a70;
      auVar80._0_16_ = local_1a80;
      auVar80._24_8_ = uStack_1a68;
      auVar80._32_8_ = uStack_1a60;
      auVar80._40_8_ = uStack_1a58;
      auVar80._48_8_ = uStack_1a50;
      auVar80._56_8_ = uStack_1a48;
      auVar79._8_4_ = -0.12420141;
      auVar79._12_4_ = -0.12420141;
      auVar79._0_4_ = -0.12420141;
      auVar79._4_4_ = -0.12420141;
      auVar79._16_4_ = -0.12420141;
      auVar79._20_4_ = -0.12420141;
      auVar79._24_4_ = -0.12420141;
      auVar79._28_4_ = -0.12420141;
      auVar79._32_4_ = -0.12420141;
      auVar79._36_4_ = -0.12420141;
      auVar79._40_4_ = -0.12420141;
      auVar79._44_4_ = -0.12420141;
      auVar79._48_4_ = -0.12420141;
      auVar79._52_4_ = -0.12420141;
      auVar79._56_4_ = -0.12420141;
      auVar79._60_4_ = -0.12420141;
      auVar108 = vfmadd213ps_avx512f(auVar80,auVar108,auVar79);
      auVar78._16_8_ = uStack_1a70;
      auVar78._0_16_ = local_1a80;
      auVar78._24_8_ = uStack_1a68;
      auVar78._32_8_ = uStack_1a60;
      auVar78._40_8_ = uStack_1a58;
      auVar78._48_8_ = uStack_1a50;
      auVar78._56_8_ = uStack_1a48;
      auVar77._8_4_ = 0.14249323;
      auVar77._12_4_ = 0.14249323;
      auVar77._0_4_ = 0.14249323;
      auVar77._4_4_ = 0.14249323;
      auVar77._16_4_ = 0.14249323;
      auVar77._20_4_ = 0.14249323;
      auVar77._24_4_ = 0.14249323;
      auVar77._28_4_ = 0.14249323;
      auVar77._32_4_ = 0.14249323;
      auVar77._36_4_ = 0.14249323;
      auVar77._40_4_ = 0.14249323;
      auVar77._44_4_ = 0.14249323;
      auVar77._48_4_ = 0.14249323;
      auVar77._52_4_ = 0.14249323;
      auVar77._56_4_ = 0.14249323;
      auVar77._60_4_ = 0.14249323;
      auVar108 = vfmadd213ps_avx512f(auVar78,auVar108,auVar77);
      auVar76._16_8_ = uStack_1a70;
      auVar76._0_16_ = local_1a80;
      auVar76._24_8_ = uStack_1a68;
      auVar76._32_8_ = uStack_1a60;
      auVar76._40_8_ = uStack_1a58;
      auVar76._48_8_ = uStack_1a50;
      auVar76._56_8_ = uStack_1a48;
      auVar75._8_4_ = -0.16668057;
      auVar75._12_4_ = -0.16668057;
      auVar75._0_4_ = -0.16668057;
      auVar75._4_4_ = -0.16668057;
      auVar75._16_4_ = -0.16668057;
      auVar75._20_4_ = -0.16668057;
      auVar75._24_4_ = -0.16668057;
      auVar75._28_4_ = -0.16668057;
      auVar75._32_4_ = -0.16668057;
      auVar75._36_4_ = -0.16668057;
      auVar75._40_4_ = -0.16668057;
      auVar75._44_4_ = -0.16668057;
      auVar75._48_4_ = -0.16668057;
      auVar75._52_4_ = -0.16668057;
      auVar75._56_4_ = -0.16668057;
      auVar75._60_4_ = -0.16668057;
      auVar108 = vfmadd213ps_avx512f(auVar76,auVar108,auVar75);
      auVar74._16_8_ = uStack_1a70;
      auVar74._0_16_ = local_1a80;
      auVar74._24_8_ = uStack_1a68;
      auVar74._32_8_ = uStack_1a60;
      auVar74._40_8_ = uStack_1a58;
      auVar74._48_8_ = uStack_1a50;
      auVar74._56_8_ = uStack_1a48;
      auVar73._8_4_ = 0.20000714;
      auVar73._12_4_ = 0.20000714;
      auVar73._0_4_ = 0.20000714;
      auVar73._4_4_ = 0.20000714;
      auVar73._16_4_ = 0.20000714;
      auVar73._20_4_ = 0.20000714;
      auVar73._24_4_ = 0.20000714;
      auVar73._28_4_ = 0.20000714;
      auVar73._32_4_ = 0.20000714;
      auVar73._36_4_ = 0.20000714;
      auVar73._40_4_ = 0.20000714;
      auVar73._44_4_ = 0.20000714;
      auVar73._48_4_ = 0.20000714;
      auVar73._52_4_ = 0.20000714;
      auVar73._56_4_ = 0.20000714;
      auVar73._60_4_ = 0.20000714;
      auVar108 = vfmadd213ps_avx512f(auVar74,auVar108,auVar73);
      auVar72._16_8_ = uStack_1a70;
      auVar72._0_16_ = local_1a80;
      auVar72._24_8_ = uStack_1a68;
      auVar72._32_8_ = uStack_1a60;
      auVar72._40_8_ = uStack_1a58;
      auVar72._48_8_ = uStack_1a50;
      auVar72._56_8_ = uStack_1a48;
      auVar71._8_4_ = -0.24999994;
      auVar71._12_4_ = -0.24999994;
      auVar71._0_4_ = -0.24999994;
      auVar71._4_4_ = -0.24999994;
      auVar71._16_4_ = -0.24999994;
      auVar71._20_4_ = -0.24999994;
      auVar71._24_4_ = -0.24999994;
      auVar71._28_4_ = -0.24999994;
      auVar71._32_4_ = -0.24999994;
      auVar71._36_4_ = -0.24999994;
      auVar71._40_4_ = -0.24999994;
      auVar71._44_4_ = -0.24999994;
      auVar71._48_4_ = -0.24999994;
      auVar71._52_4_ = -0.24999994;
      auVar71._56_4_ = -0.24999994;
      auVar71._60_4_ = -0.24999994;
      auVar108 = vfmadd213ps_avx512f(auVar72,auVar108,auVar71);
      auVar70._16_8_ = uStack_1a70;
      auVar70._0_16_ = local_1a80;
      auVar70._24_8_ = uStack_1a68;
      auVar70._32_8_ = uStack_1a60;
      auVar70._40_8_ = uStack_1a58;
      auVar70._48_8_ = uStack_1a50;
      auVar70._56_8_ = uStack_1a48;
      auVar69._8_4_ = 0.3333333;
      auVar69._12_4_ = 0.3333333;
      auVar69._0_4_ = 0.3333333;
      auVar69._4_4_ = 0.3333333;
      auVar69._16_4_ = 0.3333333;
      auVar69._20_4_ = 0.3333333;
      auVar69._24_4_ = 0.3333333;
      auVar69._28_4_ = 0.3333333;
      auVar69._32_4_ = 0.3333333;
      auVar69._36_4_ = 0.3333333;
      auVar69._40_4_ = 0.3333333;
      auVar69._44_4_ = 0.3333333;
      auVar69._48_4_ = 0.3333333;
      auVar69._52_4_ = 0.3333333;
      auVar69._56_4_ = 0.3333333;
      auVar69._60_4_ = 0.3333333;
      auVar108 = vfmadd213ps_avx512f(auVar70,auVar108,auVar69);
      auVar89._16_8_ = uStack_1a70;
      auVar89._0_16_ = local_1a80;
      auVar89._24_8_ = uStack_1a68;
      auVar89._32_8_ = uStack_1a60;
      auVar89._40_8_ = uStack_1a58;
      auVar89._48_8_ = uStack_1a50;
      auVar89._56_8_ = uStack_1a48;
      auVar108 = vmulps_avx512f(auVar108,auVar89);
      auVar108 = vmulps_avx512f(auVar108,auVar107);
      uStack_1b68 = auVar18._24_8_;
      uStack_1b60 = auVar97._32_8_;
      uStack_1b58 = auVar98._40_8_;
      uStack_1b50 = auVar99._48_8_;
      uStack_1b48 = auVar106._56_8_;
      auVar68._16_8_ = uStack_1b70;
      auVar68._0_16_ = local_1b80;
      auVar68._24_8_ = uStack_1b68;
      auVar68._32_8_ = uStack_1b60;
      auVar68._40_8_ = uStack_1b58;
      auVar68._48_8_ = uStack_1b50;
      auVar68._56_8_ = uStack_1b48;
      auVar67._8_4_ = -0.00021219444;
      auVar67._12_4_ = -0.00021219444;
      auVar67._0_4_ = -0.00021219444;
      auVar67._4_4_ = -0.00021219444;
      auVar67._16_4_ = -0.00021219444;
      auVar67._20_4_ = -0.00021219444;
      auVar67._24_4_ = -0.00021219444;
      auVar67._28_4_ = -0.00021219444;
      auVar67._32_4_ = -0.00021219444;
      auVar67._36_4_ = -0.00021219444;
      auVar67._40_4_ = -0.00021219444;
      auVar67._44_4_ = -0.00021219444;
      auVar67._48_4_ = -0.00021219444;
      auVar67._52_4_ = -0.00021219444;
      auVar67._56_4_ = -0.00021219444;
      auVar67._60_4_ = -0.00021219444;
      auVar106 = vfmadd213ps_avx512f(auVar67,auVar68,auVar108);
      auVar94._8_4_ = 0.5;
      auVar94._12_4_ = 0.5;
      auVar94._0_4_ = 0.5;
      auVar94._4_4_ = 0.5;
      auVar94._16_4_ = 0.5;
      auVar94._20_4_ = 0.5;
      auVar94._24_4_ = 0.5;
      auVar94._28_4_ = 0.5;
      auVar94._32_4_ = 0.5;
      auVar94._36_4_ = 0.5;
      auVar94._40_4_ = 0.5;
      auVar94._44_4_ = 0.5;
      auVar94._48_4_ = 0.5;
      auVar94._52_4_ = 0.5;
      auVar94._56_4_ = 0.5;
      auVar94._60_4_ = 0.5;
      auVar106 = vfnmadd213ps_avx512f(auVar94,auVar107,auVar106);
      auVar86._16_8_ = uStack_1a70;
      auVar86._0_16_ = local_1a80;
      auVar86._24_8_ = uStack_1a68;
      auVar86._32_8_ = uStack_1a60;
      auVar86._40_8_ = uStack_1a58;
      auVar86._48_8_ = uStack_1a50;
      auVar86._56_8_ = uStack_1a48;
      auVar106 = vaddps_avx512f(auVar86,auVar106);
      auVar66._16_8_ = uStack_1b70;
      auVar66._0_16_ = local_1b80;
      auVar66._24_8_ = uStack_1b68;
      auVar66._32_8_ = uStack_1b60;
      auVar66._40_8_ = uStack_1b58;
      auVar66._48_8_ = uStack_1b50;
      auVar66._56_8_ = uStack_1b48;
      auVar65._8_4_ = 0.6933594;
      auVar65._12_4_ = 0.6933594;
      auVar65._0_4_ = 0.6933594;
      auVar65._4_4_ = 0.6933594;
      auVar65._16_4_ = 0.6933594;
      auVar65._20_4_ = 0.6933594;
      auVar65._24_4_ = 0.6933594;
      auVar65._28_4_ = 0.6933594;
      auVar65._32_4_ = 0.6933594;
      auVar65._36_4_ = 0.6933594;
      auVar65._40_4_ = 0.6933594;
      auVar65._44_4_ = 0.6933594;
      auVar65._48_4_ = 0.6933594;
      auVar65._52_4_ = 0.6933594;
      auVar65._56_4_ = 0.6933594;
      auVar65._60_4_ = 0.6933594;
      auVar107 = vfmadd213ps_avx512f(auVar65,auVar66,auVar106);
      auVar106 = vpmovm2d_avx512dq(uVar20 & 0xffff);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vmovdqa64_avx512f(auVar107);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vpord_avx512f(auVar107,auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar108 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar109 = vbroadcastss_avx512f(ZEXT416(0x40000000));
      auVar106 = vmulps_avx512f(auVar106,auVar109);
      auVar112 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar106 = vsubps_avx512f(ZEXT1664(ZEXT816(0)),auVar106);
      auVar58._8_4_ = 88.37626;
      auVar58._12_4_ = 88.37626;
      auVar58._0_4_ = 88.37626;
      auVar58._4_4_ = 88.37626;
      auVar58._16_4_ = 88.37626;
      auVar58._20_4_ = 88.37626;
      auVar58._24_4_ = 88.37626;
      auVar58._28_4_ = 88.37626;
      auVar58._32_4_ = 88.37626;
      auVar58._36_4_ = 88.37626;
      auVar58._40_4_ = 88.37626;
      auVar58._44_4_ = 88.37626;
      auVar58._48_4_ = 88.37626;
      auVar58._52_4_ = 88.37626;
      auVar58._56_4_ = 88.37626;
      auVar58._60_4_ = 88.37626;
      auVar106 = vminps_avx512f(auVar106,auVar58);
      auVar57._8_4_ = -88.37626;
      auVar57._12_4_ = -88.37626;
      auVar57._0_4_ = -88.37626;
      auVar57._4_4_ = -88.37626;
      auVar57._16_4_ = -88.37626;
      auVar57._20_4_ = -88.37626;
      auVar57._24_4_ = -88.37626;
      auVar57._28_4_ = -88.37626;
      auVar57._32_4_ = -88.37626;
      auVar57._36_4_ = -88.37626;
      auVar57._40_4_ = -88.37626;
      auVar57._44_4_ = -88.37626;
      auVar57._48_4_ = -88.37626;
      auVar57._52_4_ = -88.37626;
      auVar57._56_4_ = -88.37626;
      auVar57._60_4_ = -88.37626;
      auVar107 = vmaxps_avx512f(auVar106,auVar57);
      auVar55._8_4_ = 1.442695;
      auVar55._12_4_ = 1.442695;
      auVar55._0_4_ = 1.442695;
      auVar55._4_4_ = 1.442695;
      auVar55._16_4_ = 1.442695;
      auVar55._20_4_ = 1.442695;
      auVar55._24_4_ = 1.442695;
      auVar55._28_4_ = 1.442695;
      auVar55._32_4_ = 1.442695;
      auVar55._36_4_ = 1.442695;
      auVar55._40_4_ = 1.442695;
      auVar55._44_4_ = 1.442695;
      auVar55._48_4_ = 1.442695;
      auVar55._52_4_ = 1.442695;
      auVar55._56_4_ = 1.442695;
      auVar55._60_4_ = 1.442695;
      auVar54._8_4_ = 0.5;
      auVar54._12_4_ = 0.5;
      auVar54._0_4_ = 0.5;
      auVar54._4_4_ = 0.5;
      auVar54._16_4_ = 0.5;
      auVar54._20_4_ = 0.5;
      auVar54._24_4_ = 0.5;
      auVar54._28_4_ = 0.5;
      auVar54._32_4_ = 0.5;
      auVar54._36_4_ = 0.5;
      auVar54._40_4_ = 0.5;
      auVar54._44_4_ = 0.5;
      auVar54._48_4_ = 0.5;
      auVar54._52_4_ = 0.5;
      auVar54._56_4_ = 0.5;
      auVar54._60_4_ = 0.5;
      auVar106 = vfmadd213ps_avx512f(auVar55,auVar107,auVar54);
      auVar113 = vrndscaleps_avx512f(auVar106,1);
      uVar19 = vcmpps_avx512f(auVar106,auVar113,1);
      uVar21 = (ushort)uVar19;
      auVar59._8_4_ = 1.0;
      auVar59._12_4_ = 1.0;
      auVar59._0_4_ = 1.0;
      auVar59._4_4_ = 1.0;
      auVar59._16_4_ = 1.0;
      auVar59._20_4_ = 1.0;
      auVar59._24_4_ = 1.0;
      auVar59._28_4_ = 1.0;
      auVar59._32_4_ = 1.0;
      auVar59._36_4_ = 1.0;
      auVar59._40_4_ = 1.0;
      auVar59._44_4_ = 1.0;
      auVar59._48_4_ = 1.0;
      auVar59._52_4_ = 1.0;
      auVar59._56_4_ = 1.0;
      auVar59._60_4_ = 1.0;
      local_2080 = auVar113._0_4_;
      iStack_207c = auVar113._4_4_;
      iStack_2078 = auVar113._8_4_;
      iStack_2074 = auVar113._12_4_;
      iStack_2070 = auVar113._16_4_;
      iStack_206c = auVar113._20_4_;
      iStack_2068 = auVar113._24_4_;
      iStack_2064 = auVar113._28_4_;
      iStack_2060 = auVar113._32_4_;
      iStack_205c = auVar113._36_4_;
      iStack_2058 = auVar113._40_4_;
      iStack_2054 = auVar113._44_4_;
      iStack_2050 = auVar113._48_4_;
      iStack_204c = auVar113._52_4_;
      iStack_2048 = auVar113._56_4_;
      iStack_2044 = auVar113._60_4_;
      auVar106 = vsubps_avx512f(auVar113,auVar59);
      bVar3 = (bool)((byte)uVar19 & 1);
      bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar6 = (bool)((byte)(uVar21 >> 3) & 1);
      bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
      bVar8 = (bool)((byte)(uVar21 >> 5) & 1);
      bVar9 = (bool)((byte)(uVar21 >> 6) & 1);
      bVar10 = (bool)((byte)(uVar21 >> 7) & 1);
      bVar11 = (byte)((ulong)uVar19 >> 8);
      bVar12 = (bool)(bVar11 >> 1 & 1);
      bVar13 = (bool)(bVar11 >> 2 & 1);
      bVar14 = (bool)(bVar11 >> 3 & 1);
      bVar15 = (bool)(bVar11 >> 4 & 1);
      bVar16 = (bool)(bVar11 >> 5 & 1);
      bVar17 = (bool)(bVar11 >> 6 & 1);
      local_2a80._4_4_ = (uint)bVar4 * auVar106._4_4_ | (uint)!bVar4 * iStack_207c;
      local_2a80._0_4_ = (uint)bVar3 * auVar106._0_4_ | (uint)!bVar3 * local_2080;
      local_2a80._8_4_ = (uint)bVar5 * auVar106._8_4_ | (uint)!bVar5 * iStack_2078;
      local_2a80._12_4_ = (uint)bVar6 * auVar106._12_4_ | (uint)!bVar6 * iStack_2074;
      uStack_2a70._0_4_ = (uint)bVar7 * auVar106._16_4_ | (uint)!bVar7 * iStack_2070;
      uStack_2a70._4_4_ = (uint)bVar8 * auVar106._20_4_ | (uint)!bVar8 * iStack_206c;
      uStack_2a68._0_4_ = (uint)bVar9 * auVar106._24_4_ | (uint)!bVar9 * iStack_2068;
      uStack_2a68._4_4_ = (uint)bVar10 * auVar106._28_4_ | (uint)!bVar10 * iStack_2064;
      auVar18 = _local_2a80;
      uStack_2a60._0_4_ =
           (uint)(bVar11 & 1) * auVar106._32_4_ | (uint)!(bool)(bVar11 & 1) * iStack_2060;
      uStack_2a60._4_4_ = (uint)bVar12 * auVar106._36_4_ | (uint)!bVar12 * iStack_205c;
      auVar97 = _local_2a80;
      uStack_2a58._0_4_ = (uint)bVar13 * auVar106._40_4_ | (uint)!bVar13 * iStack_2058;
      uStack_2a58._4_4_ = (uint)bVar14 * auVar106._44_4_ | (uint)!bVar14 * iStack_2054;
      auVar98 = _local_2a80;
      uStack_2a50._0_4_ = (uint)bVar15 * auVar106._48_4_ | (uint)!bVar15 * iStack_2050;
      uStack_2a50._4_4_ = (uint)bVar16 * auVar106._52_4_ | (uint)!bVar16 * iStack_204c;
      auVar99 = _local_2a80;
      uStack_2a48._0_4_ = (uint)bVar17 * auVar106._56_4_ | (uint)!bVar17 * iStack_2048;
      uStack_2a48._4_4_ =
           (uint)(bVar11 >> 7) * auVar106._60_4_ | (uint)!(bool)(bVar11 >> 7) * iStack_2044;
      auVar106 = _local_2a80;
      uStack_2a68 = auVar18._24_8_;
      uStack_2a60 = auVar97._32_8_;
      uStack_2a58 = auVar98._40_8_;
      uStack_2a50 = auVar99._48_8_;
      uStack_2a48 = auVar106._56_8_;
      auVar63._16_8_ = uStack_2a70;
      auVar63._0_16_ = local_2a80;
      auVar63._24_8_ = uStack_2a68;
      auVar63._32_8_ = uStack_2a60;
      auVar63._40_8_ = uStack_2a58;
      auVar63._48_8_ = uStack_2a50;
      auVar63._56_8_ = uStack_2a48;
      auVar62._8_4_ = 0.6933594;
      auVar62._12_4_ = 0.6933594;
      auVar62._0_4_ = 0.6933594;
      auVar62._4_4_ = 0.6933594;
      auVar62._16_4_ = 0.6933594;
      auVar62._20_4_ = 0.6933594;
      auVar62._24_4_ = 0.6933594;
      auVar62._28_4_ = 0.6933594;
      auVar62._32_4_ = 0.6933594;
      auVar62._36_4_ = 0.6933594;
      auVar62._40_4_ = 0.6933594;
      auVar62._44_4_ = 0.6933594;
      auVar62._48_4_ = 0.6933594;
      auVar62._52_4_ = 0.6933594;
      auVar62._56_4_ = 0.6933594;
      auVar62._60_4_ = 0.6933594;
      auVar106 = vfnmadd213ps_avx512f(auVar62,auVar63,auVar107);
      auVar61._16_8_ = uStack_2a70;
      auVar61._0_16_ = local_2a80;
      auVar61._24_8_ = uStack_2a68;
      auVar61._32_8_ = uStack_2a60;
      auVar61._40_8_ = uStack_2a58;
      auVar61._48_8_ = uStack_2a50;
      auVar61._56_8_ = uStack_2a48;
      auVar60._8_4_ = -0.00021219444;
      auVar60._12_4_ = -0.00021219444;
      auVar60._0_4_ = -0.00021219444;
      auVar60._4_4_ = -0.00021219444;
      auVar60._16_4_ = -0.00021219444;
      auVar60._20_4_ = -0.00021219444;
      auVar60._24_4_ = -0.00021219444;
      auVar60._28_4_ = -0.00021219444;
      auVar60._32_4_ = -0.00021219444;
      auVar60._36_4_ = -0.00021219444;
      auVar60._40_4_ = -0.00021219444;
      auVar60._44_4_ = -0.00021219444;
      auVar60._48_4_ = -0.00021219444;
      auVar60._52_4_ = -0.00021219444;
      auVar60._56_4_ = -0.00021219444;
      auVar60._60_4_ = -0.00021219444;
      auVar106 = vfnmadd213ps_avx512f(auVar60,auVar61,auVar106);
      auVar107 = vmulps_avx512f(auVar106,auVar106);
      local_2b80._8_4_ = 0.00019875691;
      local_2b80._12_4_ = 0.00019875691;
      local_2b80._0_4_ = 0.00019875691;
      local_2b80._4_4_ = 0.00019875691;
      auVar53._16_4_ = 0.00019875691;
      auVar53._20_4_ = 0.00019875691;
      auVar53._0_16_ = local_2b80._0_16_;
      auVar53._24_4_ = 0.00019875691;
      auVar53._28_4_ = 0.00019875691;
      auVar53._32_4_ = 0.00019875691;
      auVar53._36_4_ = 0.00019875691;
      auVar53._40_4_ = 0.00019875691;
      auVar53._44_4_ = 0.00019875691;
      auVar53._48_4_ = 0.00019875691;
      auVar53._52_4_ = 0.00019875691;
      auVar53._56_4_ = 0.00019875691;
      auVar53._60_4_ = 0.00019875691;
      auVar52._8_4_ = 0.0013981999;
      auVar52._12_4_ = 0.0013981999;
      auVar52._0_4_ = 0.0013981999;
      auVar52._4_4_ = 0.0013981999;
      auVar52._16_4_ = 0.0013981999;
      auVar52._20_4_ = 0.0013981999;
      auVar52._24_4_ = 0.0013981999;
      auVar52._28_4_ = 0.0013981999;
      auVar52._32_4_ = 0.0013981999;
      auVar52._36_4_ = 0.0013981999;
      auVar52._40_4_ = 0.0013981999;
      auVar52._44_4_ = 0.0013981999;
      auVar52._48_4_ = 0.0013981999;
      auVar52._52_4_ = 0.0013981999;
      auVar52._56_4_ = 0.0013981999;
      auVar52._60_4_ = 0.0013981999;
      auVar113 = vfmadd213ps_avx512f(auVar106,auVar53,auVar52);
      auVar51._8_4_ = 0.008333452;
      auVar51._12_4_ = 0.008333452;
      auVar51._0_4_ = 0.008333452;
      auVar51._4_4_ = 0.008333452;
      auVar51._16_4_ = 0.008333452;
      auVar51._20_4_ = 0.008333452;
      auVar51._24_4_ = 0.008333452;
      auVar51._28_4_ = 0.008333452;
      auVar51._32_4_ = 0.008333452;
      auVar51._36_4_ = 0.008333452;
      auVar51._40_4_ = 0.008333452;
      auVar51._44_4_ = 0.008333452;
      auVar51._48_4_ = 0.008333452;
      auVar51._52_4_ = 0.008333452;
      auVar51._56_4_ = 0.008333452;
      auVar51._60_4_ = 0.008333452;
      auVar113 = vfmadd213ps_avx512f(auVar106,auVar113,auVar51);
      auVar50._8_4_ = 0.041665796;
      auVar50._12_4_ = 0.041665796;
      auVar50._0_4_ = 0.041665796;
      auVar50._4_4_ = 0.041665796;
      auVar50._16_4_ = 0.041665796;
      auVar50._20_4_ = 0.041665796;
      auVar50._24_4_ = 0.041665796;
      auVar50._28_4_ = 0.041665796;
      auVar50._32_4_ = 0.041665796;
      auVar50._36_4_ = 0.041665796;
      auVar50._40_4_ = 0.041665796;
      auVar50._44_4_ = 0.041665796;
      auVar50._48_4_ = 0.041665796;
      auVar50._52_4_ = 0.041665796;
      auVar50._56_4_ = 0.041665796;
      auVar50._60_4_ = 0.041665796;
      auVar113 = vfmadd213ps_avx512f(auVar106,auVar113,auVar50);
      auVar49._8_4_ = 0.16666666;
      auVar49._12_4_ = 0.16666666;
      auVar49._0_4_ = 0.16666666;
      auVar49._4_4_ = 0.16666666;
      auVar49._16_4_ = 0.16666666;
      auVar49._20_4_ = 0.16666666;
      auVar49._24_4_ = 0.16666666;
      auVar49._28_4_ = 0.16666666;
      auVar49._32_4_ = 0.16666666;
      auVar49._36_4_ = 0.16666666;
      auVar49._40_4_ = 0.16666666;
      auVar49._44_4_ = 0.16666666;
      auVar49._48_4_ = 0.16666666;
      auVar49._52_4_ = 0.16666666;
      auVar49._56_4_ = 0.16666666;
      auVar49._60_4_ = 0.16666666;
      auVar113 = vfmadd213ps_avx512f(auVar106,auVar113,auVar49);
      auVar48._8_4_ = 0.5;
      auVar48._12_4_ = 0.5;
      auVar48._0_4_ = 0.5;
      auVar48._4_4_ = 0.5;
      auVar48._16_4_ = 0.5;
      auVar48._20_4_ = 0.5;
      auVar48._24_4_ = 0.5;
      auVar48._28_4_ = 0.5;
      auVar48._32_4_ = 0.5;
      auVar48._36_4_ = 0.5;
      auVar48._40_4_ = 0.5;
      auVar48._44_4_ = 0.5;
      auVar48._48_4_ = 0.5;
      auVar48._52_4_ = 0.5;
      auVar48._56_4_ = 0.5;
      auVar48._60_4_ = 0.5;
      auVar113 = vfmadd213ps_avx512f(auVar106,auVar113,auVar48);
      auVar106 = vfmadd213ps_avx512f(auVar107,auVar113,auVar106);
      auVar56._8_4_ = 1.0;
      auVar56._12_4_ = 1.0;
      auVar56._0_4_ = 1.0;
      auVar56._4_4_ = 1.0;
      auVar56._16_4_ = 1.0;
      auVar56._20_4_ = 1.0;
      auVar56._24_4_ = 1.0;
      auVar56._28_4_ = 1.0;
      auVar56._32_4_ = 1.0;
      auVar56._36_4_ = 1.0;
      auVar56._40_4_ = 1.0;
      auVar56._44_4_ = 1.0;
      auVar56._48_4_ = 1.0;
      auVar56._52_4_ = 1.0;
      auVar56._56_4_ = 1.0;
      auVar56._60_4_ = 1.0;
      auVar113 = vaddps_avx512f(auVar106,auVar56);
      auVar64._16_8_ = uStack_2a70;
      auVar64._0_16_ = local_2a80;
      auVar64._24_8_ = uStack_2a68;
      auVar64._32_8_ = uStack_2a60;
      auVar64._40_8_ = uStack_2a58;
      auVar64._48_8_ = uStack_2a50;
      auVar64._56_8_ = uStack_2a48;
      auVar106 = vcvttps2dq_avx512f(auVar64);
      vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vmovdqa64_avx512f(auVar107);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar107 = vmovdqa64_avx512f(auVar107);
      auVar106 = vpaddd_avx512f(auVar106,auVar107);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vpslld_avx512f(auVar106,ZEXT416(0x17));
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmovdqa64_avx512f(auVar106);
      auVar106 = vmulps_avx512f(auVar113,auVar106);
      auVar106 = vaddps_avx512f(auVar112,auVar106);
      auVar107 = vrcp14ps_avx512f(auVar106);
      auVar113 = vmulps_avx512f(auVar112,auVar107);
      auVar106 = vfmsub213ps_avx512f(auVar113,auVar106,auVar112);
      auVar106 = vfnmadd213ps_avx512f(auVar106,auVar107,auVar113);
      auVar107 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar107 = vpxord_avx512f(auVar108,auVar107);
      auVar106 = vfmadd213ps_avx512f(auVar109,auVar106,auVar107);
      local_6380 = vmulps_avx512f(local_6380,auVar106);
      break;
    case 6:
      auVar106 = vbroadcastss_avx512f(ZEXT416(*(uint *)*in_R9));
      auVar107 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*in_R9 + 4)));
      auVar108 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar106 = vfmadd213ps_avx512f(auVar106,local_6380,auVar107);
      auVar106 = vmaxps_avx512f(auVar106,ZEXT1664(ZEXT816(0)));
      auVar106 = vminps_avx512f(auVar106,auVar108);
      local_6380 = vmulps_avx512f(auVar106,local_6380);
    }
    puVar105 = (undefined8 *)(*in_RSI + (long)(local_7584 << 4) * 4);
    local_7600._0_8_ = local_6380._0_8_;
    local_7600._8_8_ = local_6380._8_8_;
    local_7600._16_8_ = local_6380._16_8_;
    local_7600._24_8_ = local_6380._24_8_;
    local_7600._32_8_ = local_6380._32_8_;
    local_7600._40_8_ = local_6380._40_8_;
    local_7600._48_8_ = local_6380._48_8_;
    *puVar105 = local_7600._0_8_;
    puVar105[1] = local_7600._8_8_;
    puVar105[2] = local_7600._16_8_;
    puVar105[3] = local_7600._24_8_;
    puVar105[4] = local_7600._32_8_;
    puVar105[5] = local_7600._40_8_;
    puVar105[6] = local_7600._48_8_;
    puVar105[7] = local_6380._56_8_;
  }
  return;
}

Assistant:

static void innerproduct_fp16s_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_fp16, const Mat& bias_data, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int num_input = bottom_blob.w * bottom_blob.elempack;
    const int num_output = top_blob.w;

    const float* bias_data_ptr = bias_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        __m512 _sum0 = _mm512_setzero_ps();
        __m512 _sum1 = _mm512_setzero_ps();
        __m512 _sum2 = _mm512_setzero_ps();
        __m512 _sum3 = _mm512_setzero_ps();
        __m512 _sum4 = _mm512_setzero_ps();
        __m512 _sum5 = _mm512_setzero_ps();
        __m512 _sum6 = _mm512_setzero_ps();
        __m512 _sum7 = _mm512_setzero_ps();

        if (bias_data_ptr)
        {
            _sum0 = _mm512_loadu_ps(bias_data_ptr + p * 16);
        }

        const unsigned short* kptr = weight_data_fp16.row<const unsigned short>(p);

        const float* sptr = bottom_blob;

        int i = 0;
        for (; i + 7 < num_input; i += 8)
        {
            __m512i _w01 = _mm512_loadu_si512(kptr);
            __m512 _val0 = _mm512_set1_ps(sptr[0]);
            __m512 _w0 = _mm512_cvtph_ps(_mm512_extracti32x8_epi32(_w01, 0));
            _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);

            __m512 _val1 = _mm512_set1_ps(sptr[1]);
            __m512 _w1 = _mm512_cvtph_ps(_mm512_extracti32x8_epi32(_w01, 1));
            _sum1 = _mm512_fmadd_ps(_val1, _w1, _sum1);

            __m512i _w23 = _mm512_loadu_si512(kptr + 32);
            __m512 _val2 = _mm512_set1_ps(sptr[2]);
            __m512 _w2 = _mm512_cvtph_ps(_mm512_extracti32x8_epi32(_w23, 0));
            _sum2 = _mm512_fmadd_ps(_val2, _w2, _sum2);

            __m512 _val3 = _mm512_set1_ps(sptr[3]);
            __m512 _w3 = _mm512_cvtph_ps(_mm512_extracti32x8_epi32(_w23, 1));
            _sum3 = _mm512_fmadd_ps(_val3, _w3, _sum3);

            __m512i _w45 = _mm512_loadu_si512(kptr + 64);
            __m512 _val4 = _mm512_set1_ps(sptr[4]);
            __m512 _w4 = _mm512_cvtph_ps(_mm512_extracti32x8_epi32(_w45, 0));
            _sum4 = _mm512_fmadd_ps(_val4, _w4, _sum4);

            __m512 _val5 = _mm512_set1_ps(sptr[5]);
            __m512 _w5 = _mm512_cvtph_ps(_mm512_extracti32x8_epi32(_w45, 1));
            _sum5 = _mm512_fmadd_ps(_val5, _w5, _sum5);

            __m512i _w67 = _mm512_loadu_si512(kptr + 96);
            __m512 _val6 = _mm512_set1_ps(sptr[6]);
            __m512 _w6 = _mm512_cvtph_ps(_mm512_extracti32x8_epi32(_w67, 0));
            _sum6 = _mm512_fmadd_ps(_val6, _w6, _sum6);

            __m512 _val7 = _mm512_set1_ps(sptr[7]);
            __m512 _w7 = _mm512_cvtph_ps(_mm512_extracti32x8_epi32(_w67, 1));
            _sum7 = _mm512_fmadd_ps(_val7, _w7, _sum7);

            sptr += 8;
            kptr += 128;
        }
        for (; i + 3 < num_input; i += 4)
        {
            __m512i _w01 = _mm512_loadu_si512(kptr);
            __m512 _val0 = _mm512_set1_ps(sptr[0]);
            __m512 _w0 = _mm512_cvtph_ps(_mm512_extracti32x8_epi32(_w01, 0));
            _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);

            __m512 _val1 = _mm512_set1_ps(sptr[1]);
            __m512 _w1 = _mm512_cvtph_ps(_mm512_extracti32x8_epi32(_w01, 1));
            _sum1 = _mm512_fmadd_ps(_val1, _w1, _sum1);

            __m512i _w23 = _mm512_loadu_si512(kptr + 32);
            __m512 _val2 = _mm512_set1_ps(sptr[2]);
            __m512 _w2 = _mm512_cvtph_ps(_mm512_extracti32x8_epi32(_w23, 0));
            _sum2 = _mm512_fmadd_ps(_val2, _w2, _sum2);

            __m512 _val3 = _mm512_set1_ps(sptr[3]);
            __m512 _w3 = _mm512_cvtph_ps(_mm512_extracti32x8_epi32(_w23, 1));
            _sum3 = _mm512_fmadd_ps(_val3, _w3, _sum3);

            sptr += 4;
            kptr += 64;
        }
        for (; i < num_input; i++)
        {
            __m512 _val = _mm512_set1_ps(sptr[0]);
            __m512 _w = _mm512_cvtph_ps(_mm256_lddqu_si256((const __m256i*)kptr));
            _sum0 = _mm512_fmadd_ps(_val, _w, _sum0);

            sptr += 1;
            kptr += 16;
        }

        _sum0 = _mm512_add_ps(_sum0, _sum1);
        _sum2 = _mm512_add_ps(_sum2, _sum3);
        _sum4 = _mm512_add_ps(_sum4, _sum5);
        _sum6 = _mm512_add_ps(_sum6, _sum7);
        _sum0 = _mm512_add_ps(_sum0, _sum2);
        _sum4 = _mm512_add_ps(_sum4, _sum6);
        _sum0 = _mm512_add_ps(_sum0, _sum4);

        _sum0 = activation_avx512(_sum0, activation_type, activation_params);

        float* outptr = top_blob;
        _mm512_storeu_ps(outptr + p * 16, _sum0);
    }
}